

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void snapshot_concurrent_compaction_test(void)

{
  bool bVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 handle_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar8;
  __atomic_base<unsigned_long> metalen;
  uint extraout_EDX;
  long extraout_RDX;
  long extraout_RDX_00;
  fdb_kvs_handle *pfVar9;
  code *pcVar10;
  fdb_doc *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar11;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fconfig_00;
  timeval *__tv;
  fdb_config *fconfig_01;
  fdb_kvs_handle **ppfVar12;
  uint uVar13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar14;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *__s;
  long lVar15;
  char *__s_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar16;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar17;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar18;
  char *pcVar19;
  ulong uVar20;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar21;
  uint uVar22;
  fdb_file_handle *pfVar23;
  fdb_doc **ppfVar24;
  fdb_kvs_handle **ppfVar25;
  ulong uVar26;
  btree *doc;
  long lVar27;
  char *pcVar28;
  fdb_kvs_config *config;
  char *pcVar29;
  uint *puVar30;
  fdb_config *fconfig_02;
  fdb_kvs_handle **ppfVar31;
  kvs_ops_stat *pkVar32;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paVar33;
  fdb_doc **doc_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 doc_01;
  fdb_kvs_handle *pfVar34;
  fdb_file_handle *dbfile;
  fdb_kvs_handle *db;
  cb_snapshot_args cb_args;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_config fconfig;
  char bodybuf [256];
  char keybuf [256];
  fdb_kvs_handle *pfStack_55f8;
  fdb_kvs_handle *pfStack_55f0;
  fdb_file_handle *pfStack_55e8;
  fdb_iterator *pfStack_55e0;
  fdb_doc *pfStack_55d8;
  fdb_kvs_handle *pfStack_55d0;
  timeval tStack_55c8;
  fdb_kvs_config fStack_55b8;
  fdb_config fStack_55a0;
  fdb_config *pfStack_54a8;
  fdb_kvs_handle *pfStack_54a0;
  fdb_kvs_handle *pfStack_5498;
  fdb_file_handle *pfStack_5490;
  fdb_kvs_handle *pfStack_5488;
  char acStack_547f [15];
  filemgr *pfStack_5470;
  docio_handle *pdStack_5468;
  btreeblk_handle *pbStack_5460;
  size_t sStack_5458;
  filemgr *pfStack_5450;
  docio_handle *pdStack_5448;
  btreeblk_handle *pbStack_5440;
  timeval tStack_5438;
  undefined1 auStack_5428 [76];
  uint uStack_53dc;
  char *pcStack_52e8;
  atomic<unsigned_long> aStack_52e0;
  btree *pbStack_52d8;
  fdb_kvs_handle *pfStack_52d0;
  fdb_kvs_handle *pfStack_52c8;
  code *pcStack_52c0;
  uint uStack_52ac;
  fdb_txn *pfStack_52a8;
  fdb_kvs_handle *pfStack_52a0;
  fdb_iterator *pfStack_5298;
  fdb_snapshot_info_t *pfStack_5290;
  int iStack_5284;
  fdb_kvs_handle *pfStack_5280;
  fdb_kvs_handle *apfStack_5278 [3];
  uint64_t uStack_5260;
  fdb_kvs_config fStack_5258;
  char acStack_5240 [8];
  timeval tStack_5238;
  char acStack_5228 [256];
  btree bStack_5128;
  char acStack_50d8 [256];
  char acStack_4fd8 [256];
  fdb_config fStack_4ed8;
  fdb_kvs_handle **ppfStack_4de0;
  fdb_kvs_handle **ppfStack_4dd8;
  fdb_kvs_handle *pfStack_4dd0;
  fdb_kvs_handle **ppfStack_4dc8;
  fdb_kvs_handle *pfStack_4dc0;
  code *pcStack_4db8;
  fdb_kvs_handle **ppfStack_4db0;
  fdb_kvs_handle *pfStack_4da8;
  fdb_kvs_handle *apfStack_4da0 [9];
  fdb_kvs_config fStack_4d58;
  timeval tStack_4d40;
  fdb_kvs_handle *apfStack_4d30 [33];
  fdb_config fStack_4c28;
  fdb_kvs_handle *apfStack_4b30 [32];
  fdb_kvs_handle *apfStack_4a30 [32];
  fdb_kvs_handle afStack_4930 [15];
  fdb_config *pfStack_2928;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2920;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2918;
  fdb_config *pfStack_2910;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2908;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2900;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_28f0;
  fdb_file_handle *pfStack_28e8;
  fdb_iterator *pfStack_28e0;
  fdb_doc *pfStack_28d8;
  fdb_kvs_handle *pfStack_28d0;
  undefined1 auStack_28c7 [15];
  timeval tStack_28b8;
  undefined1 auStack_28a8 [72];
  fdb_config fStack_2860;
  timeval *ptStack_2768;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2760;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2758;
  fdb_config *pfStack_2750;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2748;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2738;
  fdb_file_handle *pfStack_2730;
  undefined4 uStack_2724;
  pthread_t pStack_2720;
  char acStack_2717 [15];
  void *pvStack_2708;
  char *pcStack_2700;
  fdb_config *pfStack_26f8;
  uint64_t uStack_26f0;
  timeval tStack_26e8;
  undefined1 auStack_26d8 [16];
  uint64_t uStack_26c8;
  fdb_config fStack_25e0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_24e0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_24d8;
  uint *puStack_24d0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_24c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_24c0;
  timeval tStack_24b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_24a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2498;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2488;
  fdb_kvs_handle *pfStack_2480;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2478;
  fdb_file_handle *pfStack_2470;
  uint uStack_2464;
  fdb_kvs_config afStack_2460 [2];
  timeval tStack_2420;
  fdb_kvs_config fStack_2410;
  fdb_kvs_info fStack_23f0;
  undefined1 auStack_23c0 [32];
  undefined1 uStack_23a0;
  undefined1 uStack_2392;
  undefined8 uStack_2388;
  code *pcStack_2368;
  undefined4 uStack_2360;
  uint *puStack_2358;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22b8;
  hbtrie_func_readkey *phStack_22b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22a0;
  fdb_file_handle *pfStack_2290;
  int iStack_2284;
  fdb_kvs_handle *pfStack_2280;
  fdb_kvs_handle *pfStack_2278;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2270;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_2268 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2240;
  char acStack_2238 [8];
  fdb_kvs_config fStack_2230;
  fdb_kvs_info fStack_2218;
  timeval tStack_21e8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_21d8 [5];
  btree *apbStack_21b0 [5];
  btree *apbStack_2188 [5];
  btree *apbStack_2160 [4];
  fdb_doc *pfStack_2140;
  char acStack_2138 [256];
  char acStack_2038 [256];
  char acStack_1f38 [256];
  fdb_config fStack_1e38;
  fdb_doc *pfStack_1d40;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1d38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1d30;
  fdb_kvs_config *pfStack_1d28;
  fdb_doc **ppfStack_1d20;
  code *pcStack_1d18;
  undefined1 auStack_1d00 [72];
  fdb_kvs_config fStack_1cb8;
  fdb_doc afStack_1ca0 [3];
  char acStack_1ba0 [256];
  char acStack_1aa0 [264];
  fdb_config fStack_1998;
  fdb_doc *pfStack_18a0;
  size_t *psStack_1898;
  fdb_doc *apfStack_13f0 [151];
  fdb_kvs_handle *pfStack_f38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_f30;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_f28;
  char *pcStack_f20;
  char *pcStack_f18;
  code *pcStack_f10;
  fdb_kvs_handle *pfStack_f00;
  int iStack_ef4;
  fdb_kvs_handle *pfStack_ef0;
  undefined1 auStack_ee8 [232];
  char acStack_e00 [8];
  char acStack_df8 [64];
  timeval tStack_db8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_da8 [5];
  btree *apbStack_d80 [5];
  btree *apbStack_d58 [5];
  btree *apbStack_d30 [5];
  fdb_config fStack_d08;
  fdb_kvs_info *pfStack_c10;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_c08;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_c00;
  fdb_kvs_handle **ppfStack_bf8;
  fdb_kvs_handle **ppfStack_bf0;
  code *pcStack_be8;
  fdb_file_handle *pfStack_bd0;
  uint uStack_bc4;
  fdb_kvs_handle *apfStack_bc0 [4];
  fdb_kvs_info fStack_ba0;
  fdb_kvs_config fStack_b70;
  char acStack_b58 [8];
  timeval tStack_b50;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_b40 [5];
  btree *apbStack_b18 [5];
  btree *apbStack_af0 [5];
  btree *apbStack_ac8 [5];
  char acStack_aa0 [256];
  char acStack_9a0 [256];
  char acStack_8a0 [256];
  fdb_config fStack_7a0;
  fdb_kvs_handle *pfStack_6a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_6a0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_698;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_690;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_688;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_680;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  fdb_kvs_handle *pfStack_660;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *paStack_658;
  long lStack_650;
  fdb_kvs_handle *pfStack_648;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_640;
  size_t sStack_638;
  fdb_kvs_handle *pfStack_630;
  timeval tStack_628;
  fdb_kvs_handle fStack_618;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3e0;
  char *pcStack_3d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_3d0;
  code *pcStack_3b8;
  undefined1 auStack_3b0 [104];
  fdb_kvs_config local_348;
  fdb_config local_330;
  char local_238 [256];
  kvs_info local_138 [11];
  
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x11998a;
  gettimeofday((timeval *)(auStack_3b0 + 0x58),(__timezone_ptr_t)0x0);
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x11998f;
  memleak_start();
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x11999c;
  fdb_get_default_config();
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x1199a9;
  fdb_get_default_kvs_config();
  local_330.compaction_cb_ctx = auStack_3b0 + 0x38;
  auStack_3b0._56_8_ = (btree *)0x0;
  auStack_3b0._64_8_ = (btree *)0x0;
  auStack_3b0._72_8_ = (filemgr *)0x0;
  local_330.wal_threshold = 0x80;
  local_330.flags = 1;
  local_330.compaction_cb = cb_snapshot;
  local_330.compaction_cb_mask = 0x11;
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x1199f2;
  system("rm -rf  mvcc_test* > errorlog.txt");
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x119a07;
  fdb_open((fdb_file_handle **)(auStack_3b0 + 0x28),"./mvcc_test1",&local_330);
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x119a21;
  fdb_kvs_open((fdb_file_handle *)auStack_3b0._40_8_,(fdb_kvs_handle **)(auStack_3b0 + 0x30),"db",
               &local_348);
  auStack_3b0._56_8_ = auStack_3b0._48_8_;
  pkVar32 = (kvs_ops_stat *)CONCAT71((int7)((ulong)(auStack_3b0 + 0x28) >> 8),1);
  uVar26 = 0;
  do {
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119a5a;
    sprintf((char *)local_138,"key%04d",uVar26);
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119a70;
    sprintf(local_238,"body%04d_update%d",uVar26,(ulong)(0x31 < (uint)uVar26));
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_3b0._48_8_;
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119a7d;
    sVar5 = strlen((char *)local_138);
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119a89;
    sVar6 = strlen(local_238);
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119a9e;
    aVar8 = handle_00;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,local_138,(size_t)(sVar5 + 1),local_238,
                       sVar6 + 1);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      auStack_3b0._32_8_ = (kvs_ops_stat *)0x119b7d;
      snapshot_concurrent_compaction_test();
LAB_00119b7d:
      auStack_3b0._32_8_ = (kvs_ops_stat *)0x119b82;
      snapshot_concurrent_compaction_test();
      goto LAB_00119b82;
    }
    if ((char)((char)(((uint)pkVar32 & 0xff) * 0x29 >> 0xb) * '2' + -1) == (char)uVar26) {
      auStack_3b0._32_8_ = (kvs_ops_stat *)0x119acd;
      aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_3b0._40_8_;
      fVar2 = fdb_commit((fdb_file_handle *)auStack_3b0._40_8_,'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_00119b7d;
    }
    uVar13 = (uint)uVar26 + 1;
    uVar26 = (ulong)uVar13;
    pkVar32 = (kvs_ops_stat *)CONCAT71((int7)((ulong)pkVar32 >> 8),(char)pkVar32 + '\x01');
  } while (uVar13 != 100);
  auStack_3b0._64_8_ = (btree *)0x200000064;
  auStack_3b0._72_4_ = 10;
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x119b0e;
  _snapshot_check((fdb_kvs_handle *)auStack_3b0._48_8_,100,2);
  auStack_3b0._32_8_ = (kvs_ops_stat *)0x119b1e;
  aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)auStack_3b0._40_8_;
  fVar2 = fdb_compact((fdb_file_handle *)auStack_3b0._40_8_,"./mvcc_test2");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119b2b;
    fdb_close((fdb_file_handle *)auStack_3b0._40_8_);
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119b30;
    fdb_shutdown();
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119b35;
    memleak_end();
    pcVar19 = "%s PASSED\n";
    if (snapshot_concurrent_compaction_test()::__test_pass != '\0') {
      pcVar19 = "%s FAILED\n";
    }
    auStack_3b0._32_8_ = (kvs_ops_stat *)0x119b66;
    fprintf(_stderr,pcVar19,"snapshot with concurrent compaction test");
    return;
  }
LAB_00119b82:
  auStack_3b0._32_8_ = cb_snapshot;
  snapshot_concurrent_compaction_test();
  pfVar9 = (fdb_kvs_handle *)auStack_3b0;
  uVar20 = 0;
  pcStack_3b8 = (code *)0x119ba5;
  auStack_3b0._16_8_ = (void *)(sVar5 + 1);
  auStack_3b0._24_8_ = local_138;
  auStack_3b0._32_8_ = pkVar32;
  gettimeofday((timeval *)auStack_3b0,(__timezone_ptr_t)0x0);
  iVar4 = *(int *)(auStack_3b0._48_8_ + 0x10);
  *(int *)(auStack_3b0._48_8_ + 0x10) = iVar4 + -1;
  if (iVar4 < 1) {
    return;
  }
  if (extraout_RDX == 0) {
    pcStack_3b8 = (code *)0x119bc5;
    _snapshot_check((fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)auStack_3b0._48_8_)->seqtree,
                    (int)*(bid_t *)(auStack_3b0._48_8_ + 8),
                    *(int *)((long)(auStack_3b0._48_8_ + 8) + 4));
    pcStack_3b8 = (code *)0x119bd0;
    _snapshot_update_docs((fdb_file_handle *)aVar8.seqtree,(cb_snapshot_args *)auStack_3b0._48_8_);
    pcStack_3b8 = (code *)0x119bde;
    _snapshot_check((fdb_kvs_handle *)
                    ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)auStack_3b0._48_8_)->seqtree,
                    (int)*(bid_t *)(auStack_3b0._48_8_ + 8),
                    *(int *)((long)(auStack_3b0._48_8_ + 8) + 4));
    return;
  }
  pcStack_3b8 = _snapshot_check;
  cb_snapshot();
  aStack_3d0.seqtree = handle_00.seqtree;
  aStack_3e0.seqtree = (btree *)auStack_3b0._48_8_;
  paVar11 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
  paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c17;
  pcStack_3d8 = local_238;
  pcStack_3b8 = (code *)uVar26;
  gettimeofday(&tStack_628,(__timezone_ptr_t)0x0);
  uStack_66c = (uint)uVar20;
  uVar13 = (int)(((uint)(uVar20 >> 0x1f) & 1) + uStack_66c) >> 1;
  paVar14 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)uVar13;
  pfVar34 = &fStack_618;
  paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c39;
  pfStack_648 = pfVar9;
  fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)pfVar34);
  lStack_650 = (long)(int)uVar13;
  if (fStack_618.kvs_config.custom_cmp != (fdb_custom_cmp_variable)((int)extraout_EDX * lStack_650))
  {
    paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119db5;
    _snapshot_check();
  }
  paStack_658 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)extraout_EDX;
  if ((int)extraout_EDX < 1) {
    paStack_658 = paVar11;
  }
  aVar8.seqtree = (btree *)0x0;
  while( true ) {
    paVar33 = paStack_658;
    if ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)aVar8.seqtree == paStack_658) {
      return;
    }
    aStack_640.seqtree = (btree *)&(aVar8.seqtree)->vsize;
    paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119c89;
    pfVar9 = pfStack_648;
    fVar2 = fdb_snapshot_open(pfStack_648,&pfStack_660,(long)aStack_640.seqtree * lStack_650);
    uVar22 = (uint)pfVar9;
    pfVar9 = pfVar34;
    __s = paVar14;
    paStack_690 = paVar11;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    if (0 < (int)uStack_66c) {
      uStack_668 = aVar8._0_4_;
      uStack_664 = (uStack_668 - ((int)(uStack_668 - 1) >> 0x1f)) - 1 | 1;
      uStack_668 = uStack_668 & 0x7ffffffe;
      paVar33 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0;
      do {
        iVar4 = (int)paVar33;
        if ((int)uVar13 <= iVar4 &&
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)aVar8.seqtree ==
            (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x0) break;
        uVar22 = uStack_664;
        if (iVar4 < (int)uVar13) {
          uVar22 = uStack_668;
        }
        __s = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
              &fStack_618.config.min_block_reuse_filesize;
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119cfe;
        sprintf((char *)__s,"key%04d",paVar33);
        handle_00.seqtree = (btree *)&fStack_618.trie;
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d1c;
        sprintf((char *)handle_00.seqtree,"body%04d_update%d",paVar33,(ulong)uVar22);
        pfVar9 = pfStack_660;
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d29;
        sVar5 = strlen((char *)__s);
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d42;
        fVar2 = fdb_get_kv(pfVar9,__s,sVar5 + 1,&pfStack_630,&sStack_638);
        pfVar34 = pfStack_630;
        if (fVar2 != FDB_RESULT_SUCCESS) {
          paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119dbf;
          _snapshot_check();
LAB_00119dbf:
          uVar22 = (int)&fStack_618 + 0x30;
          paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119dcf;
          _snapshot_check();
          paStack_690 = paVar14;
          goto LAB_00119dcf;
        }
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d5b;
        iVar3 = bcmp(pfStack_630,handle_00.seqtree,sStack_638);
        pfVar9 = pfVar34;
        if (iVar3 != 0) goto LAB_00119dbf;
        paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d67;
        fdb_free_block(pfVar34);
        paVar33 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)(ulong)(iVar4 + 1U);
        paVar11 = paVar14;
      } while (uStack_66c != iVar4 + 1U);
    }
    paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d82;
    fVar2 = fdb_kvs_close(pfStack_660);
    aVar8 = aStack_640;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)0x119d99;
      _snapshot_check();
      return;
    }
  }
LAB_00119dcf:
  paStack_680 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)rollback_to_zero_test;
  _snapshot_check();
  pcStack_be8 = (code *)0x119df6;
  pfStack_6a8 = pfVar9;
  aStack_6a0 = aVar8;
  aStack_698 = handle_00;
  paStack_688 = paVar33;
  paStack_680 = __s;
  gettimeofday((timeval *)(acStack_b58 + 8),(__timezone_ptr_t)0x0);
  pcStack_be8 = (code *)0x119dfb;
  memleak_start();
  pcStack_be8 = (code *)0x119e07;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_be8 = (code *)0x119e17;
  fdb_get_default_config();
  pcStack_be8 = (code *)0x119e21;
  fdb_get_default_kvs_config();
  fStack_7a0.buffercache_size = 0;
  fStack_7a0.wal_threshold = 0x400;
  fStack_7a0.flags = 1;
  fStack_7a0.compaction_threshold = '\0';
  pcStack_be8 = (code *)0x119e54;
  fStack_7a0.multi_kv_instances = (bool)(char)uVar22;
  fdb_open(&pfStack_bd0,"./mvcc_test1",&fStack_7a0);
  uStack_bc4 = uVar22;
  if (uVar22 == 0) {
    pcStack_be8 = (code *)0x119ec3;
    fdb_kvs_open_default(pfStack_bd0,apfStack_bc0,&fStack_b70);
    lVar15 = 1;
  }
  else {
    ppfVar12 = apfStack_bc0;
    aVar8.seqtree = (btree *)&fStack_b70;
    uVar26 = 0;
    do {
      pcStack_be8 = (code *)0x119e88;
      sprintf(acStack_b58,"kv%d",uVar26 & 0xffffffff);
      pcStack_be8 = (code *)0x119e9b;
      fdb_kvs_open(pfStack_bd0,ppfVar12,acStack_b58,(fdb_kvs_config *)aVar8.seqtree);
      uVar26 = uVar26 + 1;
      ppfVar12 = ppfVar12 + 1;
    } while (uVar26 != 4);
    lVar15 = 4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  ppfVar12 = (fdb_kvs_handle **)0x0;
  pcVar10 = logCallbackFunc;
  pcVar19 = "rollback_to_zero_test";
  do {
    pfVar9 = apfStack_bc0[(long)ppfVar12];
    pcStack_be8 = (code *)0x119ee9;
    fVar2 = fdb_set_log_callback(pfVar9,logCallbackFunc,"rollback_to_zero_test");
    iVar4 = (int)pfVar9;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_be8 = (code *)0x11a472;
      rollback_to_zero_test();
      goto LAB_0011a472;
    }
    ppfVar12 = (fdb_kvs_handle **)((long)ppfVar12 + 1);
  } while ((fdb_kvs_handle **)lVar15 != ppfVar12);
  uVar26 = 0;
  do {
    pcStack_be8 = (code *)0x119f18;
    sprintf(acStack_9a0,"key%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x119f34;
    sprintf(acStack_aa0,"meta%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x119f50;
    sprintf(acStack_8a0,"body%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x119f63;
    sVar5 = strlen(acStack_9a0);
    pcStack_be8 = (code *)0x119f6e;
    sVar6 = strlen(acStack_aa0);
    pcStack_be8 = (code *)0x119f79;
    sVar7 = strlen(acStack_8a0);
    pcStack_be8 = (code *)0x119f9e;
    fdb_doc_create((fdb_doc **)&aaStack_b40[uVar26].seqtree,acStack_9a0,sVar5,acStack_aa0,sVar6,
                   acStack_8a0,sVar7);
    lVar27 = 0;
    do {
      pcStack_be8 = (code *)0x119fae;
      fdb_set(apfStack_bc0[lVar27],(fdb_doc *)aaStack_b40[uVar26].seqtree);
      lVar27 = lVar27 + 1;
    } while (lVar15 != lVar27);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 5);
  pcStack_be8 = (code *)0x119fd2;
  fdb_commit(pfStack_bd0,'\x01');
  uVar26 = 5;
  do {
    pcStack_be8 = (code *)0x119ff4;
    sprintf(acStack_9a0,"key%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x11a010;
    sprintf(acStack_aa0,"meta%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x11a02c;
    sprintf(acStack_8a0,"body%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x11a03f;
    sVar5 = strlen(acStack_9a0);
    pcStack_be8 = (code *)0x11a04a;
    sVar6 = strlen(acStack_aa0);
    pcStack_be8 = (code *)0x11a055;
    sVar7 = strlen(acStack_8a0);
    pcStack_be8 = (code *)0x11a07a;
    fdb_doc_create((fdb_doc **)&aaStack_b40[uVar26].seqtree,acStack_9a0,sVar5,acStack_aa0,sVar6,
                   acStack_8a0,sVar7);
    lVar27 = 0;
    do {
      pcStack_be8 = (code *)0x11a08b;
      fdb_set(apfStack_bc0[lVar27],(fdb_doc *)aaStack_b40[uVar26].seqtree);
      lVar27 = lVar27 + 1;
    } while (lVar15 != lVar27);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 10);
  pcStack_be8 = (code *)0x11a0ac;
  fdb_commit(pfStack_bd0,'\0');
  uVar26 = 10;
  do {
    pcStack_be8 = (code *)0x11a0ce;
    sprintf(acStack_9a0,"key%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x11a0ea;
    sprintf(acStack_aa0,"meta%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x11a106;
    sprintf(acStack_8a0,"body%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x11a119;
    sVar5 = strlen(acStack_9a0);
    pcStack_be8 = (code *)0x11a124;
    sVar6 = strlen(acStack_aa0);
    pcStack_be8 = (code *)0x11a12f;
    sVar7 = strlen(acStack_8a0);
    pcStack_be8 = (code *)0x11a154;
    fdb_doc_create((fdb_doc **)&aaStack_b40[uVar26].seqtree,acStack_9a0,sVar5,acStack_aa0,sVar6,
                   acStack_8a0,sVar7);
    lVar27 = 0;
    do {
      pcStack_be8 = (code *)0x11a165;
      fdb_set(apfStack_bc0[lVar27],(fdb_doc *)aaStack_b40[uVar26].seqtree);
      lVar27 = lVar27 + 1;
    } while (lVar15 != lVar27);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 0xf);
  pcStack_be8 = (code *)0x11a189;
  fdb_commit(pfStack_bd0,'\x01');
  uVar26 = 0xf;
  do {
    pcStack_be8 = (code *)0x11a1ab;
    sprintf(acStack_9a0,"key%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x11a1c7;
    sprintf(acStack_aa0,"meta%d",uVar26 & 0xffffffff);
    pcStack_be8 = (code *)0x11a1e3;
    sprintf(acStack_8a0,"body%d",uVar26 & 0xffffffff);
    aVar8.seqtree = (btree *)(aaStack_b40 + uVar26);
    pcStack_be8 = (code *)0x11a1f6;
    sVar5 = strlen(acStack_9a0);
    pcStack_be8 = (code *)0x11a201;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_aa0);
    pcStack_be8 = (code *)0x11a20c;
    sVar6 = strlen(acStack_8a0);
    pcStack_be8 = (code *)0x11a231;
    fdb_doc_create((fdb_doc **)aVar8.seqtree,acStack_9a0,sVar5,acStack_aa0,(size_t)handle_00,
                   acStack_8a0,sVar6);
    ppfVar12 = (fdb_kvs_handle **)0x0;
    do {
      pcStack_be8 = (code *)0x11a242;
      fdb_set(apfStack_bc0[(long)ppfVar12],
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(aVar8.seqtree)->ksize)->seqtree);
      ppfVar12 = (fdb_kvs_handle **)((long)ppfVar12 + 1);
    } while ((fdb_kvs_handle **)lVar15 != ppfVar12);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 0x14);
  pcStack_be8 = (code *)0x11a263;
  fdb_commit(pfStack_bd0,'\0');
  pcVar10 = (code *)(ulong)uStack_bc4;
  if ((char)uStack_bc4 != '\0') {
    aVar8.seqtree = (btree *)&fStack_ba0.doc_count;
    handle_00.seqtree = (btree *)&fStack_ba0.space_used;
    pcVar10 = (code *)(apfStack_bc0 + 4);
    pcVar19 = (char *)apfStack_bc0;
    do {
      ppfVar12 = (fdb_kvs_handle **)pcVar19;
      pcStack_be8 = (code *)0x11a290;
      ppfVar31 = ppfVar12;
      fVar2 = fdb_rollback(ppfVar12,0);
      iVar4 = (int)ppfVar31;
      pcVar19 = (char *)ppfVar12;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a477;
      pfVar9 = *ppfVar12;
      pcStack_be8 = (code *)0x11a2a6;
      fVar2 = fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)pcVar10);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a472;
      if (fStack_ba0.last_seqnum != 0) {
        pcStack_be8 = (code *)0x11a30f;
        rollback_to_zero_test();
      }
      if (fStack_ba0.doc_count != 0) {
        pcStack_be8 = (code *)0x11a319;
        rollback_to_zero_test();
      }
      if (fStack_ba0.space_used != 0) {
        pcStack_be8 = (code *)0x11a323;
        rollback_to_zero_test();
      }
      pfVar9 = *ppfVar12;
      pcStack_be8 = (code *)0x11a2d6;
      fVar2 = fdb_get(pfVar9,(fdb_doc *)aaStack_b40[0].seqtree);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a481;
      pfVar9 = *ppfVar12;
      pcStack_be8 = (code *)0x11a2ef;
      fVar2 = fdb_set(pfVar9,(fdb_doc *)aaStack_b40[0].seqtree);
      iVar4 = (int)pfVar9;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a47c;
      pcVar19 = (char *)(ppfVar12 + 1);
      lVar15 = lVar15 + -1;
    } while (lVar15 != 0);
LAB_0011a3bb:
    pcStack_be8 = (code *)0x11a3ca;
    pfVar23 = pfStack_bd0;
    fVar2 = fdb_commit(pfStack_bd0,'\x01');
    iVar4 = (int)pfVar23;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_be8 = (code *)0x11a3dc;
      fdb_close(pfStack_bd0);
      lVar15 = 0;
      do {
        pcStack_be8 = (code *)0x11a3eb;
        fdb_doc_free((fdb_doc *)aaStack_b40[lVar15].seqtree);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x14);
      pcStack_be8 = (code *)0x11a3f9;
      fdb_shutdown();
      pcStack_be8 = (code *)0x11a3fe;
      memleak_end();
      pcVar19 = "single kv mode:";
      if ((char)uStack_bc4 != '\0') {
        pcVar19 = "multiple kv mode:";
      }
      pcStack_be8 = (code *)0x11a42e;
      sprintf(acStack_8a0,"rollback to zero test %s",pcVar19);
      pcVar19 = "%s PASSED\n";
      if (rollback_to_zero_test(bool)::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_be8 = (code *)0x11a45b;
      fprintf(_stderr,pcVar19,acStack_8a0);
      return;
    }
    goto LAB_0011a486;
  }
  ppfVar31 = apfStack_bc0;
  pcStack_be8 = (code *)0x11a331;
  fVar2 = fdb_rollback(ppfVar31,0);
  iVar4 = (int)ppfVar31;
  pcVar19 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a48b;
  pcStack_be8 = (code *)0x11a348;
  pfVar9 = apfStack_bc0[0];
  fVar2 = fdb_get_kvs_info(apfStack_bc0[0],(fdb_kvs_info *)(apfStack_bc0 + 4));
  iVar4 = (int)pfVar9;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a490;
  if (fStack_ba0.last_seqnum != 0) {
    pcStack_be8 = (code *)0x11a362;
    rollback_to_zero_test();
  }
  if (fStack_ba0.doc_count != 0) {
    pcStack_be8 = (code *)0x11a374;
    rollback_to_zero_test();
  }
  if (fStack_ba0.space_used != 0) {
    pcStack_be8 = (code *)0x11a386;
    rollback_to_zero_test();
  }
  pcStack_be8 = (code *)0x11a398;
  pfVar9 = apfStack_bc0[0];
  fVar2 = fdb_get(apfStack_bc0[0],(fdb_doc *)aaStack_b40[0].seqtree);
  iVar4 = (int)pfVar9;
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a495;
  pcStack_be8 = (code *)0x11a3b3;
  fVar2 = fdb_set(apfStack_bc0[0],(fdb_doc *)aaStack_b40[0].seqtree);
  iVar4 = (int)apfStack_bc0[0];
  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011a3bb;
  goto LAB_0011a49a;
LAB_0011aacb:
  pcStack_f10 = (code *)0x11aad0;
  rollback_to_zero_after_compact_test();
LAB_0011aad0:
  pcStack_f10 = (code *)0x11aad5;
  rollback_to_zero_after_compact_test();
LAB_0011aad5:
  pcStack_f10 = (code *)0x11aada;
  rollback_to_zero_after_compact_test();
LAB_0011aada:
  pcStack_f10 = (code *)0x11aadf;
  rollback_to_zero_after_compact_test();
  goto LAB_0011aadf;
LAB_0011b7d0:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7d5;
  rollback_all_test();
LAB_0011b7d5:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7da;
  rollback_all_test();
LAB_0011b7da:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e2;
  rollback_all_test();
  aVar21 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar10;
LAB_0011b7e2:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e7;
  rollback_all_test();
LAB_0011b7e7:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7ec;
  rollback_all_test();
LAB_0011b7ec:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7f1;
  rollback_all_test();
LAB_0011b7f1:
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7f6;
  rollback_all_test();
  goto LAB_0011b7f6;
LAB_0011bfab:
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb0;
  rollback_during_ops_test();
LAB_0011bfb0:
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb5;
  rollback_during_ops_test();
  goto LAB_0011bfb5;
LAB_0011c3a8:
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3ad;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c3ad;
LAB_0011c7bd:
  pcStack_4db8 = (code *)0x11c7c2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c2:
  pcStack_4db8 = (code *)0x11c7c7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c7:
  pcStack_4db8 = (code *)0x11c7cc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7cc:
  pcStack_4db8 = (code *)0x11c7d1;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d1:
  pcStack_4db8 = (code *)0x11c7d6;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d6:
  pcStack_4db8 = (code *)0x11c7db;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7db:
  pcStack_4db8 = (code *)0x11c7e0;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c7e0;
LAB_0011cd0f:
  pcStack_52c0 = (code *)0x11cd14;
  rollback_without_seqtree();
  goto LAB_0011cd14;
LAB_0011d0a5:
  pfStack_5498 = (fdb_kvs_handle *)0x11d0aa;
  tx_crash_recover_test();
LAB_0011d0aa:
  pfStack_5498 = (fdb_kvs_handle *)0x11d0af;
  tx_crash_recover_test();
  goto LAB_0011d0af;
LAB_0011a472:
  pcStack_be8 = (code *)0x11a477;
  rollback_to_zero_test();
LAB_0011a477:
  pcStack_be8 = (code *)0x11a47c;
  rollback_to_zero_test();
LAB_0011a47c:
  pcStack_be8 = (code *)0x11a481;
  rollback_to_zero_test();
LAB_0011a481:
  pcStack_be8 = (code *)0x11a486;
  rollback_to_zero_test();
LAB_0011a486:
  pcStack_be8 = (code *)0x11a48b;
  rollback_to_zero_test();
LAB_0011a48b:
  pcStack_be8 = (code *)0x11a490;
  rollback_to_zero_test();
LAB_0011a490:
  pcStack_be8 = (code *)0x11a495;
  rollback_to_zero_test();
LAB_0011a495:
  pcStack_be8 = (code *)0x11a49a;
  rollback_to_zero_test();
LAB_0011a49a:
  pcStack_be8 = rollback_to_zero_after_compact_test;
  rollback_to_zero_test();
  pcStack_f10 = (code *)0x11a4c1;
  pfStack_c10 = (fdb_kvs_info *)pcVar10;
  aStack_c08 = aVar8;
  aStack_c00 = handle_00;
  ppfStack_bf8 = ppfVar12;
  ppfStack_bf0 = (fdb_kvs_handle **)pcVar19;
  pcStack_be8 = (code *)lVar15;
  gettimeofday(&tStack_db8,(__timezone_ptr_t)0x0);
  pcStack_f10 = (code *)0x11a4cd;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_f10 = (code *)0x11a4dd;
  fdb_get_default_config();
  pcStack_f10 = (code *)0x11a4ea;
  fdb_get_default_kvs_config();
  fStack_d08.buffercache_size = 0;
  fStack_d08.wal_threshold = 0x400;
  fStack_d08.flags = 1;
  fStack_d08.compaction_threshold = '\0';
  pcStack_f10 = (code *)0x11a51d;
  fStack_d08.multi_kv_instances = (bool)(char)iVar4;
  fdb_open((fdb_file_handle **)&pfStack_f00,"./mvcc_test1",&fStack_d08);
  iStack_ef4 = iVar4;
  if (iVar4 == 0) {
    pcStack_f10 = (code *)0x11a592;
    fdb_kvs_open_default
              ((fdb_file_handle *)pfStack_f00,(fdb_kvs_handle **)auStack_ee8,
               (fdb_kvs_config *)(auStack_ee8 + 0xd0));
    pcVar19 = (char *)0x1;
  }
  else {
    ppfVar12 = (fdb_kvs_handle **)auStack_ee8;
    aVar8.seqtree = (btree *)(auStack_ee8 + 0xd0);
    uVar26 = 0;
    do {
      pcStack_f10 = (code *)0x11a554;
      sprintf(acStack_e00,"kv%d",uVar26 & 0xffffffff);
      pcStack_f10 = (code *)0x11a567;
      fdb_kvs_open((fdb_file_handle *)pfStack_f00,ppfVar12,acStack_e00,
                   (fdb_kvs_config *)aVar8.seqtree);
      uVar26 = uVar26 + 1;
      ppfVar12 = ppfVar12 + 1;
    } while (uVar26 != 4);
    pcVar19 = (char *)0x4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar29 = (char *)0x0;
  pcVar10 = logCallbackFunc;
  pcVar28 = "rollback_to_zero_after_compact_test";
  do {
    pfVar9 = *(fdb_kvs_handle **)(auStack_ee8 + (long)pcVar29 * 8);
    pcStack_f10 = (code *)0x11a5b8;
    fVar2 = fdb_set_log_callback(pfVar9,logCallbackFunc,"rollback_to_zero_after_compact_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_f10 = (code *)0x11aacb;
      rollback_to_zero_after_compact_test();
      goto LAB_0011aacb;
    }
    pcVar29 = pcVar29 + 1;
  } while (pcVar19 != pcVar29);
  uVar26 = 0;
  do {
    pcStack_f10 = (code *)0x11a5e7;
    sprintf(auStack_ee8 + 0x90,"key%d",uVar26 & 0xffffffff);
    pcStack_f10 = (code *)0x11a5fd;
    sprintf(auStack_ee8 + 0x50,"meta%d",uVar26 & 0xffffffff);
    pcStack_f10 = (code *)0x11a616;
    sprintf(acStack_df8,"body%d",uVar26 & 0xffffffff);
    pcStack_f10 = (code *)0x11a629;
    sVar5 = strlen(auStack_ee8 + 0x90);
    pcStack_f10 = (code *)0x11a639;
    sVar6 = strlen(auStack_ee8 + 0x50);
    pcStack_f10 = (code *)0x11a649;
    sVar7 = strlen(acStack_df8);
    pcStack_f10 = (code *)0x11a66e;
    fdb_doc_create((fdb_doc **)&aaStack_da8[uVar26].seqtree,auStack_ee8 + 0x90,sVar5,
                   auStack_ee8 + 0x50,sVar6,acStack_df8,sVar7);
    lVar15 = 0;
    do {
      pcStack_f10 = (code *)0x11a67f;
      fdb_set(*(fdb_kvs_handle **)(auStack_ee8 + lVar15 * 8),(fdb_doc *)aaStack_da8[uVar26].seqtree)
      ;
      lVar15 = lVar15 + 1;
    } while (pcVar19 != (char *)lVar15);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 5);
  pcStack_f10 = (code *)0x11a6a3;
  fdb_commit((fdb_file_handle *)pfStack_f00,'\x01');
  uVar26 = 5;
  do {
    pcStack_f10 = (code *)0x11a6c5;
    sprintf(auStack_ee8 + 0x90,"key%d",uVar26 & 0xffffffff);
    pcStack_f10 = (code *)0x11a6de;
    sprintf(auStack_ee8 + 0x50,"meta%d",uVar26 & 0xffffffff);
    pcStack_f10 = (code *)0x11a6fa;
    sprintf(acStack_df8,"body%d",uVar26 & 0xffffffff);
    pcStack_f10 = (code *)0x11a70d;
    sVar5 = strlen(auStack_ee8 + 0x90);
    pcStack_f10 = (code *)0x11a718;
    sVar6 = strlen(auStack_ee8 + 0x50);
    pcStack_f10 = (code *)0x11a723;
    sVar7 = strlen(acStack_df8);
    pcStack_f10 = (code *)0x11a745;
    fdb_doc_create((fdb_doc **)&aaStack_da8[uVar26].seqtree,auStack_ee8 + 0x90,sVar5,
                   auStack_ee8 + 0x50,sVar6,acStack_df8,sVar7);
    lVar15 = 0;
    do {
      pcStack_f10 = (code *)0x11a755;
      fdb_set(*(fdb_kvs_handle **)(auStack_ee8 + lVar15 * 8),(fdb_doc *)aaStack_da8[uVar26].seqtree)
      ;
      lVar15 = lVar15 + 1;
    } while (pcVar19 != (char *)lVar15);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 10);
  pcStack_f10 = (code *)0x11a776;
  fdb_commit((fdb_file_handle *)pfStack_f00,'\0');
  uVar26 = 10;
  do {
    pcStack_f10 = (code *)0x11a798;
    sprintf(auStack_ee8 + 0x90,"key%d",uVar26 & 0xffffffff);
    pcStack_f10 = (code *)0x11a7b1;
    sprintf(auStack_ee8 + 0x50,"meta%d",uVar26 & 0xffffffff);
    pcStack_f10 = (code *)0x11a7cd;
    sprintf(acStack_df8,"body%d",uVar26 & 0xffffffff);
    pcStack_f10 = (code *)0x11a7e0;
    sVar5 = strlen(auStack_ee8 + 0x90);
    pcStack_f10 = (code *)0x11a7eb;
    sVar6 = strlen(auStack_ee8 + 0x50);
    pcStack_f10 = (code *)0x11a7f6;
    sVar7 = strlen(acStack_df8);
    pcStack_f10 = (code *)0x11a818;
    fdb_doc_create((fdb_doc **)&aaStack_da8[uVar26].seqtree,auStack_ee8 + 0x90,sVar5,
                   auStack_ee8 + 0x50,sVar6,acStack_df8,sVar7);
    lVar15 = 0;
    do {
      pcStack_f10 = (code *)0x11a828;
      fdb_set(*(fdb_kvs_handle **)(auStack_ee8 + lVar15 * 8),(fdb_doc *)aaStack_da8[uVar26].seqtree)
      ;
      lVar15 = lVar15 + 1;
    } while (pcVar19 != (char *)lVar15);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 0xf);
  pcStack_f10 = (code *)0x11a84c;
  fdb_commit((fdb_file_handle *)pfStack_f00,'\x01');
  uVar26 = 0xf;
  do {
    pcStack_f10 = (code *)0x11a86e;
    sprintf(auStack_ee8 + 0x90,"key%d",uVar26 & 0xffffffff);
    pcStack_f10 = (code *)0x11a887;
    sprintf(auStack_ee8 + 0x50,"meta%d",uVar26 & 0xffffffff);
    pcVar29 = acStack_df8;
    pcStack_f10 = (code *)0x11a8a3;
    sprintf(pcVar29,"body%d",uVar26 & 0xffffffff);
    handle_00.seqtree = (btree *)(aaStack_da8 + uVar26);
    pcStack_f10 = (code *)0x11a8b6;
    sVar5 = strlen(auStack_ee8 + 0x90);
    pcStack_f10 = (code *)0x11a8c1;
    aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(auStack_ee8 + 0x50);
    pcStack_f10 = (code *)0x11a8cc;
    sVar6 = strlen(pcVar29);
    pcStack_f10 = (code *)0x11a8ee;
    fdb_doc_create((fdb_doc **)handle_00.seqtree,auStack_ee8 + 0x90,sVar5,auStack_ee8 + 0x50,
                   (size_t)aVar8,pcVar29,sVar6);
    pcVar10 = (code *)0x0;
    do {
      pcStack_f10 = (code *)0x11a8fe;
      fdb_set(*(fdb_kvs_handle **)(auStack_ee8 + (long)pcVar10 * 8),
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(handle_00.seqtree)->ksize)->
              seqtree);
      pcVar10 = (code *)((long)pcVar10 + 1);
    } while ((code *)pcVar19 != pcVar10);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 0x14);
  pcStack_f10 = (code *)0x11a91f;
  fdb_commit((fdb_file_handle *)pfStack_f00,'\0');
  pfVar9 = (fdb_kvs_handle *)&pfStack_ef0;
  pcStack_f10 = (code *)0x11a938;
  fVar2 = fdb_open((fdb_file_handle **)pfVar9,"./mvcc_test1",&fStack_d08);
  pcVar28 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_f10 = (code *)0x11a951;
    pfVar9 = pfStack_ef0;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_ef0,"./mvcc_test2");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aae4;
    pcStack_f10 = (code *)0x11a963;
    fdb_close((fdb_file_handle *)pfStack_ef0);
    pcVar29 = auStack_ee8 + 0x30;
    aVar8.seqtree = (btree *)(auStack_ee8 + 0x40);
    pcVar19 = (char *)(ulong)(uint)((int)pcVar19 << 3);
    pcVar28 = (char *)0x0;
    handle_00.seqtree = (btree *)(auStack_ee8 + 0x20);
    do {
      pcVar10 = (code *)(auStack_ee8 + (long)pcVar28);
      pcStack_f10 = (code *)0x11a98a;
      pfVar9 = (fdb_kvs_handle *)pcVar10;
      fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar10,0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aad0;
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_f10 = (code *)0x11a99d;
      fVar2 = fdb_get_kvs_info(pfVar9,(fdb_kvs_info *)handle_00.seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aacb;
      if ((hbtrie *)auStack_ee8._40_8_ != (hbtrie *)0x0) {
        pcStack_f10 = (code *)0x11aa03;
        rollback_to_zero_after_compact_test();
      }
      if ((btree *)auStack_ee8._48_8_ != (btree *)0x0) {
        pcStack_f10 = (code *)0x11aa0d;
        rollback_to_zero_after_compact_test();
      }
      if ((filemgr *)auStack_ee8._64_8_ != (filemgr *)0x0) {
        pcStack_f10 = (code *)0x11aa17;
        rollback_to_zero_after_compact_test();
      }
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_f10 = (code *)0x11a9cd;
      fVar2 = fdb_get(pfVar9,(fdb_doc *)aaStack_da8[0].seqtree);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011aada;
      pfVar9 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar10)->kvs_config;
      pcStack_f10 = (code *)0x11a9e6;
      fVar2 = fdb_set(pfVar9,(fdb_doc *)aaStack_da8[0].seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aad5;
      pcVar28 = pcVar28 + 8;
    } while (pcVar19 != pcVar28);
    pcStack_f10 = (code *)0x11aa28;
    pfVar9 = pfStack_f00;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_f00,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_f10 = (code *)0x11aa3a;
      fdb_close((fdb_file_handle *)pfStack_f00);
      lVar15 = 0;
      do {
        pcStack_f10 = (code *)0x11aa49;
        fdb_doc_free((fdb_doc *)aaStack_da8[lVar15].seqtree);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x14);
      pcStack_f10 = (code *)0x11aa57;
      fdb_shutdown();
      pcVar19 = "single kv mode:";
      if ((char)iStack_ef4 != '\0') {
        pcVar19 = "multiple kv mode:";
      }
      pcStack_f10 = (code *)0x11aa87;
      sprintf(acStack_df8,"rollback to zero after compact test %s",pcVar19);
      pcVar19 = "%s PASSED\n";
      if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_f10 = (code *)0x11aab4;
      fprintf(_stderr,pcVar19,acStack_df8);
      return;
    }
  }
  else {
LAB_0011aadf:
    pcStack_f10 = (code *)0x11aae4;
    rollback_to_zero_after_compact_test();
LAB_0011aae4:
    pcStack_f10 = (code *)0x11aae9;
    rollback_to_zero_after_compact_test();
  }
  pcStack_f10 = rollback_to_wal_test;
  rollback_to_zero_after_compact_test();
  __s_00 = (char *)((ulong)pfVar9 & 0xffffffff);
  pcStack_1d18 = (code *)0x11ab0d;
  pfStack_f38 = (fdb_kvs_handle *)pcVar10;
  aStack_f30 = aVar8;
  aStack_f28 = handle_00;
  pcStack_f20 = pcVar28;
  pcStack_f18 = pcVar29;
  pcStack_f10 = (code *)pcVar19;
  gettimeofday((timeval *)(auStack_1d00 + 0x38),(__timezone_ptr_t)0x0);
  pcStack_1d18 = (code *)0x11ab12;
  memleak_start();
  pcStack_1d18 = (code *)0x11ab1e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_1d18 = (code *)0x11ab2e;
  fdb_get_default_config();
  config = &fStack_1cb8;
  pcStack_1d18 = (code *)0x11ab3b;
  fdb_get_default_kvs_config();
  fStack_1998.buffercache_size = 0;
  fStack_1998.wal_threshold = 0x100;
  fStack_1998.flags = 1;
  fStack_1998.compaction_threshold = '\0';
  auStack_1d00._28_4_ = SUB84(pfVar9,0);
  fStack_1998.multi_kv_instances = SUB81(__s_00,0);
  doc_00 = (fdb_doc **)(auStack_1d00 + 8);
  pcStack_1d18 = (code *)0x11ab75;
  fdb_open((fdb_file_handle **)doc_00,"./mvcc_test8",&fStack_1998);
  ptr_handle = (fdb_doc *)auStack_1d00;
  pcStack_1d18 = (code *)0x11ab88;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1d00._8_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_1d18 = (code *)0x11ab9e;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1d00._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar15 = 0;
    uVar26 = 0;
    do {
      pcStack_1d18 = (code *)0x11abc8;
      sprintf(acStack_1ba0,"key%d",uVar26 & 0xffffffff);
      pcStack_1d18 = (code *)0x11abe1;
      sprintf(acStack_1aa0,"meta%d",uVar26 & 0xffffffff);
      pcStack_1d18 = (code *)0x11abf7;
      sprintf((char *)afStack_1ca0,"body%d",uVar26 & 0xffffffff);
      pcStack_1d18 = (code *)0x11ac0a;
      sVar5 = strlen(acStack_1ba0);
      pcStack_1d18 = (code *)0x11ac1d;
      sVar6 = strlen(acStack_1aa0);
      pcStack_1d18 = (code *)0x11ac2a;
      sVar7 = strlen((char *)afStack_1ca0);
      pcStack_1d18 = (code *)0x11ac4c;
      fdb_doc_create((fdb_doc **)((long)&pfStack_18a0 + lVar15),acStack_1ba0,sVar5,acStack_1aa0,
                     sVar6,afStack_1ca0,sVar7);
      pcStack_1d18 = (code *)0x11ac5e;
      fdb_set((fdb_kvs_handle *)auStack_1d00._0_8_,(&pfStack_18a0)[uVar26]);
      uVar26 = uVar26 + 1;
      lVar15 = lVar15 + 8;
    } while (uVar26 != 300);
    pcStack_1d18 = (code *)0x11ac7e;
    fdb_commit((fdb_file_handle *)auStack_1d00._8_8_,'\0');
    lVar15 = 0;
    uVar26 = 0;
    do {
      auStack_1d00._40_8_ = (fdb_doc **)((long)&pfStack_18a0 + lVar15);
      pcStack_1d18 = (code *)0x11aca0;
      fdb_doc_free((&pfStack_18a0)[uVar26]);
      pcStack_1d18 = (code *)0x11acbc;
      sprintf(acStack_1ba0,"key%d",uVar26 & 0xffffffff);
      pcStack_1d18 = (code *)0x11acd8;
      sprintf(acStack_1aa0,"META%d",uVar26 & 0xffffffff);
      pcStack_1d18 = (code *)0x11acf1;
      sprintf((char *)afStack_1ca0,"BODY%d",uVar26 & 0xffffffff);
      pcStack_1d18 = (code *)0x11acf9;
      sVar5 = strlen(acStack_1ba0);
      pcStack_1d18 = (code *)0x11ad04;
      sVar6 = strlen(acStack_1aa0);
      pcStack_1d18 = (code *)0x11ad0f;
      sVar7 = strlen((char *)afStack_1ca0);
      pcStack_1d18 = (code *)0x11ad31;
      fdb_doc_create((fdb_doc **)auStack_1d00._40_8_,acStack_1ba0,sVar5,acStack_1aa0,sVar6,
                     afStack_1ca0,sVar7);
      pcStack_1d18 = (code *)0x11ad43;
      fdb_set((fdb_kvs_handle *)auStack_1d00._0_8_,(&pfStack_18a0)[uVar26]);
      uVar26 = uVar26 + 1;
      lVar15 = lVar15 + 8;
    } while (uVar26 != 0x96);
    pcStack_1d18 = (code *)0x11ad63;
    fdb_commit((fdb_file_handle *)auStack_1d00._8_8_,'\0');
    uVar26 = 0x96;
    doc_00 = apfStack_13f0;
    do {
      pcStack_1d18 = (code *)0x11ad79;
      fdb_doc_free(*doc_00);
      pcStack_1d18 = (code *)0x11ad95;
      sprintf(acStack_1ba0,"key%d",uVar26 & 0xffffffff);
      __s_00 = acStack_1aa0;
      pcStack_1d18 = (code *)0x11adb1;
      sprintf(__s_00,"Meta%d",uVar26 & 0xffffffff);
      ptr_handle = afStack_1ca0;
      pcStack_1d18 = (code *)0x11adca;
      sprintf((char *)ptr_handle,"Body%d",uVar26 & 0xffffffff);
      pcStack_1d18 = (code *)0x11add2;
      aVar8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1ba0);
      pcStack_1d18 = (code *)0x11addd;
      handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(__s_00);
      pcStack_1d18 = (code *)0x11ade8;
      sVar5 = strlen((char *)ptr_handle);
      pcStack_1d18 = (code *)0x11ae08;
      fdb_doc_create(doc_00,acStack_1ba0,(size_t)aVar8,__s_00,(size_t)handle_00,ptr_handle,sVar5);
      pcStack_1d18 = (code *)0x11ae15;
      fdb_set((fdb_kvs_handle *)auStack_1d00._0_8_,*doc_00);
      uVar26 = uVar26 + 1;
      doc_00 = doc_00 + 1;
    } while (uVar26 != 300);
    pcStack_1d18 = (code *)0x11ae35;
    fdb_commit((fdb_file_handle *)auStack_1d00._8_8_,'\0');
    pcStack_1d18 = (code *)0x11ae44;
    fVar2 = fdb_rollback((fdb_kvs_handle **)auStack_1d00,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afa5;
    pcStack_1d18 = (code *)0x11ae75;
    fdb_doc_create((fdb_doc **)(auStack_1d00 + 0x10),(void *)psStack_1898[4],*psStack_1898,
                   (void *)0x0,0,(void *)0x0,0);
    pcStack_1d18 = (code *)0x11ae89;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1d00._0_8_,
                              (fdb_kvs_handle **)(auStack_1d00 + 0x20),0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaa;
    pcStack_1d18 = (code *)0x11aea0;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_1d00._32_8_,(fdb_doc *)auStack_1d00._16_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaf;
    config = *(fdb_kvs_config **)(auStack_1d00._16_8_ + 0x40);
    doc_00 = (fdb_doc **)psStack_1898[8];
    pcStack_1d18 = (code *)0x11aecc;
    iVar4 = bcmp(config,doc_00,*(size_t *)(auStack_1d00._16_8_ + 0x10));
    ptr_handle = (fdb_doc *)auStack_1d00._16_8_;
    if (iVar4 == 0) {
      if (*(fdb_seqnum_t *)(auStack_1d00._16_8_ + 0x28) != 0x12e) {
        pcStack_1d18 = (code *)0x11aef0;
        rollback_to_wal_test();
        auStack_1d00._16_8_ = auStack_1d00._48_8_;
      }
      pcStack_1d18 = (code *)0x11aefb;
      fdb_doc_free((fdb_doc *)auStack_1d00._16_8_);
      pcStack_1d18 = (code *)0x11af05;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1d00._32_8_);
      pcStack_1d18 = (code *)0x11af0f;
      fdb_close((fdb_file_handle *)auStack_1d00._8_8_);
      lVar15 = 0;
      do {
        pcStack_1d18 = (code *)0x11af1e;
        fdb_doc_free((&pfStack_18a0)[lVar15]);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 300);
      pcStack_1d18 = (code *)0x11af2f;
      fdb_shutdown();
      pcStack_1d18 = (code *)0x11af34;
      memleak_end();
      pcVar19 = "single kv mode:";
      if (auStack_1d00[0x1c] != '\0') {
        pcVar19 = "multiple kv mode:";
      }
      pcStack_1d18 = (code *)0x11af61;
      sprintf((char *)afStack_1ca0,"rollback to wal test %s",pcVar19);
      pcVar19 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_1d18 = (code *)0x11af8e;
      fprintf(_stderr,pcVar19,afStack_1ca0);
      return;
    }
  }
  else {
    pcStack_1d18 = (code *)0x11afa5;
    rollback_to_wal_test();
LAB_0011afa5:
    pcStack_1d18 = (code *)0x11afaa;
    rollback_to_wal_test();
LAB_0011afaa:
    pcStack_1d18 = (code *)0x11afaf;
    rollback_to_wal_test();
LAB_0011afaf:
    pcStack_1d18 = (code *)0x11afb4;
    rollback_to_wal_test();
  }
  pcStack_1d18 = rollback_all_test;
  ppfVar24 = doc_00;
  rollback_to_wal_test();
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe4;
  pfStack_1d40 = ptr_handle;
  aStack_1d38 = aVar8;
  aStack_1d30 = handle_00;
  pfStack_1d28 = config;
  ppfStack_1d20 = doc_00;
  pcStack_1d18 = (code *)__s_00;
  gettimeofday(&tStack_21e8,(__timezone_ptr_t)0x0);
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe9;
  memleak_start();
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aff5;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b005;
  fdb_get_default_config();
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b00f;
  fdb_get_default_kvs_config();
  fStack_1e38.buffercache_size._0_1_ = '\0';
  fStack_1e38.buffercache_size._1_1_ = '\0';
  fStack_1e38.buffercache_size._2_1_ = '\0';
  fStack_1e38.buffercache_size._3_1_ = '\0';
  fStack_1e38.buffercache_size._4_1_ = '\0';
  fStack_1e38.buffercache_size._5_1_ = '\0';
  fStack_1e38.buffercache_size._6_1_ = '\0';
  fStack_1e38.buffercache_size._7_1_ = '\0';
  fStack_1e38.wal_threshold._0_1_ = '\0';
  fStack_1e38.wal_threshold._1_1_ = '\x04';
  fStack_1e38.wal_threshold._2_1_ = '\0';
  fStack_1e38.wal_threshold._3_1_ = '\0';
  fStack_1e38.wal_threshold._4_1_ = '\0';
  fStack_1e38.wal_threshold._5_1_ = '\0';
  fStack_1e38.wal_threshold._6_1_ = '\0';
  fStack_1e38.wal_threshold._7_1_ = '\0';
  fStack_1e38.flags = 1;
  fStack_1e38.compaction_threshold = 0;
  fStack_1e38.block_reusing_threshold = 0;
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b045;
  fStack_1e38.multi_kv_instances = (bool)(char)ppfVar24;
  fdb_open(&pfStack_2290,"./mvcc_test6",(fdb_config *)(acStack_1f38 + 0x100));
  iStack_2284 = (int)ppfVar24;
  if (iStack_2284 == 0) {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0b1;
    fdb_kvs_open_default
              (pfStack_2290,(fdb_kvs_handle **)&aaStack_2268[0].seqtree,
               (fdb_kvs_config *)(acStack_2238 + 8));
    aVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
  }
  else {
    paVar11 = aaStack_2268;
    aVar8.seqtree = (btree *)(acStack_2238 + 8);
    uVar26 = 0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b076;
      sprintf(acStack_2238,"kv%d",uVar26 & 0xffffffff);
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b089;
      fdb_kvs_open(pfStack_2290,(fdb_kvs_handle **)&paVar11->seqtree,acStack_2238,
                   (fdb_kvs_config *)aVar8.seqtree);
      uVar26 = uVar26 + 1;
      paVar11 = paVar11 + 1;
    } while (uVar26 != 4);
    aVar16 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar29 = (char *)0x0;
  pcVar10 = logCallbackFunc;
  pcVar19 = "rollback_all_test";
  do {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0d7;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)aaStack_2268[(long)pcVar29].seqtree,logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7d0;
      rollback_all_test();
      goto LAB_0011b7d0;
    }
    pcVar29 = (char *)((hbtrie_func_readkey *)pcVar29 + 1);
  } while (aVar16.seqtree != (btree *)pcVar29);
  uVar26 = 0;
  do {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b106;
    sprintf(acStack_2038,"key%d",uVar26 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b122;
    sprintf(acStack_2138,"meta%d",uVar26 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b13e;
    sprintf(acStack_1f38,"body%d",uVar26 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b151;
    sVar5 = strlen(acStack_2038);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b15c;
    sVar6 = strlen(acStack_2138);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b167;
    sVar7 = strlen(acStack_1f38);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b18c;
    fdb_doc_create((fdb_doc **)&aaStack_21d8[uVar26].seqtree,acStack_2038,sVar5,acStack_2138,sVar6,
                   acStack_1f38,sVar7);
    lVar15 = 0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b19c;
      fdb_set((fdb_kvs_handle *)aaStack_2268[lVar15].seqtree,(fdb_doc *)aaStack_21d8[uVar26].seqtree
             );
      lVar15 = lVar15 + 1;
    } while (aVar16.seqtree != (btree *)lVar15);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 5);
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1c0;
  fdb_commit(pfStack_2290,'\x01');
  uVar26 = 5;
  do {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1e2;
    sprintf(acStack_2038,"key%d",uVar26 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1fe;
    sprintf(acStack_2138,"meta%d",uVar26 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b21a;
    sprintf(acStack_1f38,"body%d",uVar26 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b22d;
    sVar5 = strlen(acStack_2038);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b238;
    sVar6 = strlen(acStack_2138);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b243;
    sVar7 = strlen(acStack_1f38);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b268;
    fdb_doc_create((fdb_doc **)&aaStack_21d8[uVar26].seqtree,acStack_2038,sVar5,acStack_2138,sVar6,
                   acStack_1f38,sVar7);
    lVar15 = 0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b279;
      fdb_set((fdb_kvs_handle *)aaStack_2268[lVar15].seqtree,(fdb_doc *)aaStack_21d8[uVar26].seqtree
             );
      lVar15 = lVar15 + 1;
    } while (aVar16.seqtree != (btree *)lVar15);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 10);
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b29a;
  fdb_commit(pfStack_2290,'\0');
  uVar26 = 10;
  do {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2bc;
    sprintf(acStack_2038,"key%d",uVar26 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2d8;
    sprintf(acStack_2138,"meta%d",uVar26 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2f4;
    sprintf(acStack_1f38,"body%d",uVar26 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b307;
    sVar5 = strlen(acStack_2038);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b312;
    sVar6 = strlen(acStack_2138);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b31d;
    sVar7 = strlen(acStack_1f38);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b342;
    fdb_doc_create((fdb_doc **)&aaStack_21d8[uVar26].seqtree,acStack_2038,sVar5,acStack_2138,sVar6,
                   acStack_1f38,sVar7);
    lVar15 = 0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b353;
      fdb_set((fdb_kvs_handle *)aaStack_2268[lVar15].seqtree,(fdb_doc *)aaStack_21d8[uVar26].seqtree
             );
      lVar15 = lVar15 + 1;
    } while (aVar16.seqtree != (btree *)lVar15);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 0xf);
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b377;
  fdb_commit(pfStack_2290,'\x01');
  uVar26 = 0xf;
  do {
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b399;
    sprintf(acStack_2038,"key%d",uVar26 & 0xffffffff);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3b5;
    sprintf(acStack_2138,"meta%d",uVar26 & 0xffffffff);
    aVar21.seqtree = (btree *)acStack_1f38;
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3d1;
    sprintf((char *)aVar21.seqtree,"body%d",uVar26 & 0xffffffff);
    aVar8.seqtree = (btree *)(aaStack_21d8 + uVar26);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3e4;
    sVar5 = strlen(acStack_2038);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ef;
    handle_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_2138);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3fa;
    sVar6 = strlen((char *)aVar21.seqtree);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b41f;
    fdb_doc_create((fdb_doc **)aVar8.seqtree,acStack_2038,sVar5,acStack_2138,(size_t)handle_00,
                   aVar21.seqtree,sVar6);
    pcVar29 = (char *)0x0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b430;
      fdb_set((fdb_kvs_handle *)aaStack_2268[(long)pcVar29].seqtree,
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(aVar8.seqtree)->ksize)->seqtree);
      pcVar29 = (char *)((long)pcVar29 + 1);
    } while (aVar16.seqtree != (btree *)pcVar29);
    uVar26 = uVar26 + 1;
  } while (uVar26 != 0x14);
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b451;
  fdb_commit(pfStack_2290,'\0');
  aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b465;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_2290,(fdb_snapshot_info_t **)&pfStack_2278,(uint64_t *)&pfStack_2280);
  pcVar19 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_2284 == '\0') {
      if (pfStack_2280 != (fdb_kvs_handle *)0x4) {
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b49b;
        rollback_all_test();
      }
    }
    else if (pfStack_2280 != (fdb_kvs_handle *)0x8) {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b489;
      rollback_all_test();
    }
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ae;
    fVar2 = fdb_rollback_all(pfStack_2290,(fdb_snapshot_marker_t)pfStack_2278->kvs);
    if ((char)iStack_2284 == '\0') {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7fb;
LAB_0011b5f4:
      aVar8.seqtree = (btree *)0x0;
      handle_00.seqtree = (btree *)&aStack_2270;
      pcVar19 = (char *)&aStack_2240;
      do {
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b613;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aaStack_2268[(long)aVar8].seqtree,&fStack_2218);
        pcVar10 = (code *)aVar21;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7d5;
        if (fStack_2218.last_seqnum != 0xf) {
          aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c7;
          rollback_all_test();
        }
        if (fStack_2218.doc_count != 0xf) {
          aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6d9;
          rollback_all_test();
        }
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b64b;
        fVar2 = fdb_get((fdb_kvs_handle *)aaStack_2268[(long)aVar8].seqtree,pfStack_2140);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b7d0;
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b673;
        fVar2 = fdb_get_kv((fdb_kvs_handle *)aaStack_2268[(long)aVar8].seqtree,
                           (aaStack_21d8[0].seqtrie)->aux,
                           *(size_t *)&(aaStack_21d8[0].seqtree)->ksize,(void **)handle_00.seqtree,
                           (size_t *)pcVar19);
        pcVar10 = (code *)aStack_2270;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e2;
        pcVar29 = (char *)(aaStack_21d8[0].seqtrie)->readkey;
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b69c;
        iVar4 = bcmp(pcVar29,aStack_2270.seqtree,(size_t)aStack_2240);
        if (iVar4 != 0) goto LAB_0011b7da;
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ac;
        free(pcVar10);
        aVar8.seqtree = (btree *)&(aVar8.seqtree)->vsize;
        aVar21 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar10;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar16.seqtree != aVar8.seqtree);
      aVar21.seqtree = (btree *)0x0;
      do {
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6f2;
        fVar2 = fdb_set((fdb_kvs_handle *)aaStack_2268[(long)aVar21].seqtree,
                        (fdb_doc *)aaStack_21d8[0].seqtree);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e7;
        aVar21.seqtree = (btree *)&(aVar21.seqtree)->vsize;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar16.seqtree != aVar21.seqtree);
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b711;
      fVar2 = fdb_commit(pfStack_2290,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b800;
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b723;
      fdb_close(pfStack_2290);
      lVar15 = 0;
      do {
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b732;
        fdb_doc_free((fdb_doc *)aaStack_21d8[lVar15].seqtree);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x14);
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b74a;
      fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_2278,(uint64_t)pfStack_2280);
      aVar21 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x14;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b757;
        fdb_shutdown();
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b75c;
        memleak_end();
        pcVar19 = "single kv mode:";
        if ((char)iStack_2284 != '\0') {
          pcVar19 = "multiple kv mode:";
        }
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b78c;
        sprintf(acStack_1f38,"rollback all test %s",pcVar19);
        pcVar19 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar19 = "%s FAILED\n";
        }
        aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7b9;
        fprintf(_stderr,pcVar19,acStack_1f38);
        return;
      }
      goto LAB_0011b805;
    }
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b80a;
    aVar21 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x0;
    do {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ce;
      fdb_kvs_close((fdb_kvs_handle *)aaStack_2268[(long)aVar21].seqtree);
      aVar21.seqtree = aVar21.seqtree + 1;
    } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar16.seqtree != aVar21.seqtree);
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4f2;
    fVar2 = fdb_open((fdb_file_handle **)&fStack_2218,"./mvcc_test6",
                     (fdb_config *)(acStack_1f38 + 0x100));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b80f;
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b518;
    fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_2218.name,(fdb_kvs_handle **)&aStack_2270.seqtree
                         ,"kv0",(fdb_kvs_config *)(acStack_2238 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b814;
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b533;
    fVar2 = fdb_rollback_all(pfStack_2290,(fdb_snapshot_marker_t)pfStack_2278->kvs);
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b819;
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b546;
    fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_2270.seqtree);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b81e;
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b55b;
    fVar2 = fdb_close((fdb_file_handle *)fStack_2218.name);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b576;
      fVar2 = fdb_rollback_all(pfStack_2290,(fdb_snapshot_marker_t)pfStack_2278->kvs);
      handle_00.seqtree = (btree *)aaStack_2268;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcVar19 = acStack_2238;
        pcVar29 = "rollback_all_test";
        aVar21.seqtree = (btree *)0x0;
        aVar8 = aVar16;
        do {
          aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5a7;
          sprintf(pcVar19,"kv%d",aVar21.seqtree);
          aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5bc;
          fVar2 = fdb_kvs_open(pfStack_2290,(fdb_kvs_handle **)handle_00.seqtree,pcVar19,
                               (fdb_kvs_config *)(acStack_2238 + 8));
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7f1;
          aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5d7;
          fVar2 = fdb_set_log_callback
                            ((fdb_kvs_handle *)
                             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             &(handle_00.seqtree)->ksize)->seqtree,logCallbackFunc,
                             "rollback_all_test");
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7ec;
          aVar21._0_4_ = aVar21._0_4_ + 1;
          aVar21._4_4_ = 0;
          handle_00.seqtree = (btree *)&(handle_00.seqtree)->root_bid;
          aVar8.seqtree = (btree *)((long)(aVar8.seqtree + -1) + 0x37);
        } while (aVar8.seqtree != (btree *)0x0);
        goto LAB_0011b5f4;
      }
      goto LAB_0011b7fb;
    }
  }
  else {
LAB_0011b7f6:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7fb;
    rollback_all_test();
LAB_0011b7fb:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b800;
    rollback_all_test();
LAB_0011b800:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b805;
    rollback_all_test();
LAB_0011b805:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80a;
    rollback_all_test();
LAB_0011b80a:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80f;
    rollback_all_test();
LAB_0011b80f:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b814;
    rollback_all_test();
LAB_0011b814:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b819;
    rollback_all_test();
LAB_0011b819:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b81e;
    rollback_all_test();
LAB_0011b81e:
    aStack_22a0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b823;
    rollback_all_test();
  }
  aStack_22a0.seqtree = (btree *)auto_compaction_snapshots_test;
  rollback_all_test();
  aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b845;
  aStack_22c8 = aVar21;
  aStack_22c0 = aVar8;
  aStack_22b8 = handle_00;
  phStack_22b0 = (hbtrie_func_readkey *)pcVar29;
  aStack_22a8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar19;
  aStack_22a0 = aVar16;
  gettimeofday(&tStack_2420,(__timezone_ptr_t)0x0);
  aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b84a;
  memleak_start();
  puVar30 = &uStack_2464;
  uStack_2464 = 0;
  aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b862;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00.seqtree = (btree *)auStack_23c0;
  aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b872;
  fdb_get_default_config();
  uStack_2392 = 1;
  uStack_23a0 = 1;
  pcStack_2368 = compaction_cb_count;
  uStack_2360 = 0x20;
  uStack_2388 = 1;
  aVar21.seqtree = (btree *)0x155054;
  aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8ac;
  puStack_2358 = puVar30;
  fVar2 = fdb_open(&pfStack_2470,"mvcc_test1",(fdb_config *)fconfig_00.seqtree);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00.seqtree = (btree *)afStack_2460;
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8c1;
    fdb_get_default_kvs_config();
    fStack_2410.custom_cmp_param = afStack_2460[0].custom_cmp_param;
    fStack_2410.create_if_missing = afStack_2460[0].create_if_missing;
    fStack_2410._1_7_ = afStack_2460[0]._1_7_;
    fStack_2410.custom_cmp = afStack_2460[0].custom_cmp;
    aVar21.seqtree = (btree *)&aStack_2478;
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8e6;
    fVar2 = fdb_kvs_open_default(pfStack_2470,(fdb_kvs_handle **)aVar21.seqtree,&fStack_2410);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbcd;
    handle_00.seqtree = (btree *)0x155958;
    aVar8.seqtree = (btree *)0x0;
    do {
      pcVar19 = (char *)0xcccccccd;
      aVar17.seqtree = (btree *)0x1555bd;
      aVar21.seqtree = (btree *)afStack_2460;
      iVar4 = aVar8._0_4_;
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b91a;
      sprintf((char *)aVar21.seqtree,"%d",aVar8.seqtree);
      aVar16 = aStack_2478;
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b927;
      sVar5 = strlen((char *)aVar21.seqtree);
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b93e;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar16.seqtree,aVar21.seqtree,sVar5,"value",5);
      aVar18.seqtree = handle_00.seqtree;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb86;
        auto_compaction_snapshots_test();
LAB_0011bb86:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb8b;
        auto_compaction_snapshots_test();
LAB_0011bb8b:
        fconfig_00 = aVar16;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb90;
        auto_compaction_snapshots_test();
LAB_0011bb90:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb95;
        auto_compaction_snapshots_test();
LAB_0011bb95:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb9a;
        auto_compaction_snapshots_test();
        handle_00 = aVar18;
        doc_01 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar19;
LAB_0011bb9a:
        aVar18 = handle_00;
        handle_00 = aVar17;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb9f;
        auto_compaction_snapshots_test();
LAB_0011bb9f:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbac;
        auto_compaction_snapshots_test();
LAB_0011bbac:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbb9;
        aVar21 = fconfig_00;
        auto_compaction_snapshots_test();
LAB_0011bbb9:
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbbe;
        auto_compaction_snapshots_test();
        aVar16 = handle_00;
        pcVar19 = (char *)doc_01;
LAB_0011bbbe:
        handle_00 = aVar18;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbc3;
        auto_compaction_snapshots_test();
LAB_0011bbc3:
        puVar30 = (uint *)afStack_2460;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbc8;
        auto_compaction_snapshots_test();
        goto LAB_0011bbc8;
      }
      aVar16 = aVar8;
      if ((int)((ulong)aVar8.seqtree / 10) * 10 == iVar4) {
        aVar21.seqtree = (btree *)0x0;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b96a;
        fVar2 = fdb_commit(pfStack_2470,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb86;
      }
      fconfig_00 = aVar8;
      if ((int)((ulong)aVar8.seqtree / 100) * 100 == iVar4) {
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b99b;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aStack_2478.seqtree,&fStack_23f0);
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)fStack_23f0.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb8b;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9bd;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2478.seqtree,&pfStack_2480,
                                  fStack_23f0.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb95;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9e3;
        fdb_doc_create((fdb_doc **)&aStack_2488.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2488.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9f6;
        fVar2 = fdb_get_byseq(pfStack_2480,(fdb_doc *)aStack_2488.seqtree);
        aVar18 = aStack_2488;
        doc_01.seqtree = (btree *)pcVar19;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb9a;
        pcVar19 = (char *)(aStack_2488.seqtrie)->aux;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba17;
        sVar5 = strlen(&afStack_2460[0].create_if_missing);
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba25;
        iVar3 = bcmp(pcVar19,afStack_2460,sVar5);
        doc_01 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar19;
        if (iVar3 != 0) goto LAB_0011bb9f;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba35;
        fdb_doc_free((fdb_doc *)aVar18.seqtree);
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba3f;
        fVar2 = fdb_kvs_close(pfStack_2480);
        aVar17.seqtree = handle_00.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb90;
        aVar21.seqtree = (btree *)&pfStack_2480;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba5d;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2478.seqtree,
                                  (fdb_kvs_handle **)aVar21.seqtree,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbb9;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba83;
        fdb_doc_create((fdb_doc **)&aStack_2488.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_2488.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba96;
        aVar21 = aStack_2488;
        fVar2 = fdb_get_byseq(pfStack_2480,(fdb_doc *)aStack_2488.seqtree);
        doc_01 = aStack_2488;
        aVar16.seqtree = handle_00.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbbe;
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(aStack_2488.seqtrie)->aux;
        aVar21.seqtree = (btree *)afStack_2460;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bab4;
        sVar5 = strlen((char *)aVar21.seqtree);
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bac2;
        iVar3 = bcmp(fconfig_00.seqtree,aVar21.seqtree,sVar5);
        if (iVar3 != 0) goto LAB_0011bbac;
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bad2;
        fdb_doc_free((fdb_doc *)doc_01.seqtree);
        aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11badc;
        fVar2 = fdb_kvs_close(pfStack_2480);
        pcVar19 = (char *)0xcccccccd;
        aVar16.seqtree = (btree *)0x1555bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011baf4;
        goto LAB_0011bbc3;
      }
LAB_0011baf4:
      puVar30 = (uint *)afStack_2460;
      pcVar19 = (char *)0xcccccccd;
      aVar16.seqtree = (btree *)0x1555bd;
      aVar8._0_4_ = iVar4 + 1;
      aVar8._4_4_ = 0;
    } while (aVar8._0_4_ != 100000);
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb0e;
    fVar2 = fdb_close(pfStack_2470);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbd2;
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb1b;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb28;
      memleak_end();
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb42;
      sprintf(&afStack_2460[0].create_if_missing,"auto compaction completed %d times with snapshots"
              ,(ulong)uStack_2464);
      pcVar19 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb6f;
      fprintf(_stderr,pcVar19,afStack_2460);
      return;
    }
  }
  else {
LAB_0011bbc8:
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbcd;
    auto_compaction_snapshots_test();
LAB_0011bbcd:
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd2;
    auto_compaction_snapshots_test();
LAB_0011bbd2:
    aStack_2498 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd7;
    auto_compaction_snapshots_test();
  }
  aStack_2498.seqtree = (btree *)compaction_cb_count;
  auto_compaction_snapshots_test();
  aVar18.seqtree = aVar21.seqtree & 0xffffffff;
  __tv = &tStack_24b0;
  aStack_24c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbf3;
  aStack_24a0 = fconfig_00;
  aStack_2498 = aVar16;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if (aVar21._0_4_ == 0x20) {
    if (extraout_RDX_00 == 0) {
      *(int *)&(aStack_2488.seqtree)->ksize = *(int *)&(aStack_2488.seqtree)->ksize + 1;
      return;
    }
  }
  else {
    aStack_24c0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc12;
    compaction_cb_count();
  }
  aStack_24c0.seqtree = (btree *)rollback_during_ops_test;
  compaction_cb_count();
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc37;
  aStack_24e0 = aVar8;
  aStack_24d8 = handle_00;
  puStack_24d0 = puVar30;
  aStack_24c8 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar19;
  aStack_24c0.seqtree = aVar18.seqtree;
  gettimeofday((timeval *)(acStack_2717 + 0x2f),(__timezone_ptr_t)0x0);
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc3c;
  memleak_start();
  uStack_2724 = 10000;
  if (__tv == (timeval *)0x0) {
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc59;
    system("rm -rf  mvcc_test* > errorlog.txt");
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc66;
    fdb_get_default_config();
    fconfig_02 = &fStack_25e0;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc7e;
    memcpy(fconfig_02,auStack_26d8,0xf8);
    fStack_25e0.block_reusing_threshold = 0;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc9d;
    fVar2 = fdb_open(&pfStack_2730,"mvcc_test1",fconfig_02);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcb2;
      fdb_get_default_kvs_config();
      uStack_26f0 = uStack_26c8;
      pcStack_2700 = (char *)auStack_26d8._0_8_;
      pfStack_26f8 = (fdb_config *)auStack_26d8._8_8_;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcd4;
      fVar2 = fdb_kvs_open_default
                        (pfStack_2730,(fdb_kvs_handle **)&aStack_2738.seqtree,
                         (fdb_kvs_config *)(acStack_2717 + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
      handle_00._0_1_ = 1;
      __tv = (timeval *)0x1;
      uVar13 = 0;
      do {
        aVar18._0_4_ = uVar13 + 1;
        aVar18._4_4_ = 0;
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd03;
        sprintf(acStack_2717,"%d",aVar18.seqtree);
        aVar8 = aStack_2738;
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd10;
        sVar5 = strlen(acStack_2717);
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd2b;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar8.seqtree,acStack_2717,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfab;
          rollback_during_ops_test();
          goto LAB_0011bfab;
        }
        if ((int)((ulong)__tv / 10) * 10 - 1U == uVar13) {
          handle_00.seqtree = handle_00.seqtree ^ 1;
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd66;
          fdb_commit(pfStack_2730,handle_00._0_1_);
        }
        __tv = (timeval *)(ulong)((int)__tv + 1);
        uVar13 = aVar18._0_4_;
      } while (aVar18._0_4_ < 10000);
      aVar18 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd8b;
      fdb_commit(pfStack_2730,'\x01');
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd9a;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_2738.seqtree,(fdb_kvs_info *)auStack_26d8);
      __tv = (timeval *)(auStack_26d8 + 8);
      if ((fdb_config *)auStack_26d8._8_8_ != (fdb_config *)0x2710) {
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdb0;
        rollback_during_ops_test();
      }
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdc8;
      pthread_create(&pStack_2720,(pthread_attr_t *)0x0,rollback_during_ops_test,&uStack_2724);
      fconfig_02 = (fdb_config *)0x155958;
      pcVar19 = acStack_2717;
      aVar8.seqtree = (btree *)0x1555bd;
      do {
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdea;
        sprintf(pcVar19,"%d",aVar18.seqtree);
        handle_00 = aStack_2738;
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdf7;
        sVar5 = strlen(pcVar19);
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be0e;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pcVar19,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfab;
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be2a;
          fVar2 = fdb_commit(pfStack_2730,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011bfb0;
        }
        aVar18._0_4_ = aVar18._0_4_ + 1;
        aVar18._4_4_ = 0;
      } while (aVar18._0_4_ != 0x2711);
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be50;
      pthread_join(pStack_2720,(void **)(acStack_2717 + 0xf));
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be73;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2738.seqtree,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e4;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be8a;
      fVar2 = fdb_commit(pfStack_2730,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e9;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bea4;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_2738.seqtree,(fdb_kvs_info *)auStack_26d8);
      fconfig_02 = (fdb_config *)auStack_26d8._8_8_;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11becb;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2738.seqtree,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ee;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bef6;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2738.seqtree,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f3;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf0d;
      fVar2 = fdb_commit(pfStack_2730,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f8;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf22;
      fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2738.seqtree,(fdb_seqnum_t)fconfig_02);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf3c;
        fdb_get_kvs_info((fdb_kvs_handle *)aStack_2738.seqtree,(fdb_kvs_info *)auStack_26d8);
        if ((fdb_config *)auStack_26d8._8_8_ != fconfig_02) {
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf4d;
          rollback_during_ops_test();
        }
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf57;
        fdb_close(pfStack_2730);
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf5c;
        fdb_shutdown();
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf61;
        memleak_end();
        pcVar19 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar19 = "%s FAILED\n";
        }
        aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf92;
        fprintf(_stderr,pcVar19,"rollback during ops test");
        return;
      }
    }
    else {
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0df;
      rollback_during_ops_test();
LAB_0011c0df:
      __tv = (timeval *)auStack_26d8;
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e4;
      rollback_during_ops_test();
LAB_0011c0e4:
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e9;
      rollback_during_ops_test();
LAB_0011c0e9:
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0ee;
      rollback_during_ops_test();
LAB_0011c0ee:
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0f3;
      rollback_during_ops_test();
LAB_0011c0f3:
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0f8;
      rollback_during_ops_test();
LAB_0011c0f8:
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0fd;
      rollback_during_ops_test();
    }
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c102;
    rollback_during_ops_test();
LAB_0011c102:
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c107;
    rollback_during_ops_test();
  }
  else {
LAB_0011bfb5:
    fconfig_02 = (fdb_config *)auStack_26d8;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc2;
    fdb_get_default_config();
    pcVar19 = (char *)&fStack_25e0;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfda;
    memcpy(pcVar19,fconfig_02,0xf8);
    fStack_25e0.block_reusing_threshold = 0;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff9;
    fVar2 = fdb_open(&pfStack_2730,"mvcc_test1",(fdb_config *)pcVar19);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c102;
    fconfig_02 = (fdb_config *)auStack_26d8;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c00e;
    fdb_get_default_kvs_config();
    uStack_26f0 = uStack_26c8;
    pcStack_2700 = (char *)auStack_26d8._0_8_;
    pfStack_26f8 = (fdb_config *)auStack_26d8._8_8_;
    aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c031;
    fVar2 = fdb_kvs_open_default
                      (pfStack_2730,(fdb_kvs_handle **)&aStack_2738.seqtree,
                       (fdb_kvs_config *)(acStack_2717 + 0x17));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      __tv = (timeval *)(long)(int)__tv->tv_sec;
      if (1 < (long)__tv) {
        handle_00.seqtree = (btree *)0xcccccccd;
        fconfig_02 = (fdb_config *)0x155958;
        pcVar19 = acStack_2717;
        aVar8.seqtree = (btree *)0x1555bd;
        do {
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c06e;
          sprintf(pcVar19,"%d",(ulong)__tv & 0xffffffff);
          aVar18 = aStack_2738;
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c07b;
          sVar5 = strlen(pcVar19);
          aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c092;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar18.seqtree,pcVar19,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c10c;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0b8;
            fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2738.seqtree,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c111;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0d3;
      fdb_close(pfStack_2730);
      aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0da;
      pthread_exit((void *)0x0);
    }
  }
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c10c;
  rollback_during_ops_test();
LAB_0011c10c:
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c111;
  rollback_during_ops_test();
LAB_0011c111:
  aStack_2748.seqtree = (btree *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c132;
  ptStack_2768 = __tv;
  aStack_2760 = aVar8;
  aStack_2758 = handle_00;
  pfStack_2750 = fconfig_02;
  aStack_2748 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar19;
  gettimeofday((timeval *)(auStack_28c7 + 0xf),(__timezone_ptr_t)0x0);
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c137;
  memleak_start();
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c143;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_01 = &fStack_2860;
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c153;
  fdb_get_default_config();
  aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c167;
  fVar2 = fdb_open(&pfStack_28e8,"mvcc_test1",fconfig_01);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_01 = (fdb_config *)(auStack_28a8 + 0x30);
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c17f;
    fdb_get_default_kvs_config();
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c191;
    fVar2 = fdb_kvs_open_default
                      (pfStack_28e8,(fdb_kvs_handle **)&aStack_28f0.seqtree,
                       (fdb_kvs_config *)fconfig_01);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b2;
    fconfig_01 = (fdb_config *)0x1;
    fconfig_02 = (fdb_config *)0x155958;
    pcVar19 = auStack_28c7;
    aVar8.seqtree = (btree *)0x1555bd;
    do {
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1c0;
      sprintf(pcVar19,"%d",fconfig_01);
      handle_00 = aStack_28f0;
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1cd;
      sVar5 = strlen(pcVar19);
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1e4;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)handle_00.seqtree,pcVar19,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3a8;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c3a8;
      }
      uVar13 = (int)fconfig_01 + 1;
      fconfig_01 = (fdb_config *)(ulong)uVar13;
    } while (uVar13 != 4);
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1ff;
    fdb_commit(pfStack_28e8,'\0');
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c222;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_28f0.seqtree,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b7;
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c24d;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_28f0.seqtree,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3bc;
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c264;
    fVar2 = fdb_commit(pfStack_28e8,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c1;
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27b;
    fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_28f0.seqtree,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c6;
    fconfig_01 = (fdb_config *)auStack_28a8;
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c295;
    fdb_get_kvs_info((fdb_kvs_handle *)aStack_28f0.seqtree,(fdb_kvs_info *)fconfig_01);
    if (auStack_28a8._8_8_ != 3) {
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2a6;
      in_memory_snapshot_rollback_test();
    }
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2bc;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_28f0.seqtree,&pfStack_28d0,0xffffffffffffffff
                             );
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3cb;
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2e4;
    fdb_iterator_init(pfStack_28d0,&pfStack_28e0,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_01 = (fdb_config *)&pfStack_28d8;
    pfStack_28d8 = (fdb_doc *)0x0;
    fconfig_02 = (fdb_config *)0x3;
    do {
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c303;
      fVar2 = fdb_iterator_get(pfStack_28e0,(fdb_doc **)fconfig_01);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3a8;
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c315;
      fdb_doc_free(pfStack_28d8);
      pfStack_28d8 = (fdb_doc *)0x0;
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c328;
      fVar2 = fdb_iterator_next(pfStack_28e0);
      fconfig_02 = (fdb_config *)&fconfig_02[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_02 == (fdb_config *)0x0) {
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c343;
      fdb_iterator_close(pfStack_28e0);
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c34d;
      fdb_kvs_close(pfStack_28d0);
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c357;
      fdb_close(pfStack_28e8);
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c35c;
      fdb_shutdown();
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c361;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c392;
      fprintf(_stderr,pcVar19,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c3ad:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3b2;
    in_memory_snapshot_rollback_test();
LAB_0011c3b2:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3b7;
    in_memory_snapshot_rollback_test();
LAB_0011c3b7:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3bc;
    in_memory_snapshot_rollback_test();
LAB_0011c3bc:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3c1;
    in_memory_snapshot_rollback_test();
LAB_0011c3c1:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3c6;
    in_memory_snapshot_rollback_test();
LAB_0011c3c6:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3cb;
    in_memory_snapshot_rollback_test();
LAB_0011c3cb:
    aStack_2900 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3d0;
    in_memory_snapshot_rollback_test();
  }
  aStack_2900.seqtree = (btree *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_4db8 = (code *)0x11c3f2;
  pfStack_2928 = fconfig_01;
  aStack_2920 = aVar8;
  aStack_2918 = handle_00;
  pfStack_2910 = fconfig_02;
  aStack_2908 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar19;
  aStack_2900 = aVar18;
  gettimeofday(&tStack_4d40,(__timezone_ptr_t)0x0);
  pcStack_4db8 = (code *)0x11c3f7;
  memleak_start();
  pcStack_4db8 = (code *)0x11c403;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_4db8 = (code *)0x11c413;
  fdb_get_default_config();
  pcStack_4db8 = (code *)0x11c41d;
  fdb_get_default_kvs_config();
  fStack_4c28.wal_threshold = 0x400;
  fStack_4c28.compaction_mode = 0;
  fStack_4c28.durability_opt = 2;
  pfVar9 = (fdb_kvs_handle *)(apfStack_4a30 + 0x20);
  ppfVar12 = apfStack_4d30;
  pcVar19 = "kvs%d";
  uVar26 = 0;
  ppfVar31 = (fdb_kvs_handle **)0x0;
  do {
    pcStack_4db8 = (code *)0x11c45d;
    sprintf((char *)ppfVar12,"mvcc_test%d",(ulong)ppfVar31 & 0xffffffff);
    pcVar29 = (char *)(apfStack_4da0 + (long)ppfVar31);
    pcStack_4db8 = (code *)0x11c478;
    ppfVar25 = (fdb_kvs_handle **)pcVar29;
    fVar2 = fdb_open((fdb_file_handle **)pcVar29,(char *)ppfVar12,
                     (fdb_config *)(apfStack_4d30 + 0x21));
    iVar4 = (int)ppfVar25;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c7;
    ppfVar25 = (fdb_kvs_handle **)0x0;
    ppfStack_4db0 = ppfVar31;
    pfStack_4da8 = pfVar9;
    do {
      ppfVar31 = ppfVar25;
      pcStack_4db8 = (code *)0x11c49d;
      sprintf((char *)ppfVar12,"kvs%d",(ulong)(uint)((int)ppfVar31 + (int)uVar26));
      pfVar34 = *(fdb_kvs_handle **)pcVar29;
      pcStack_4db8 = (code *)0x11c4b0;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar34,(fdb_kvs_handle **)pfVar9,(char *)ppfVar12,
                           (fdb_kvs_config *)(apfStack_4da0 + 9));
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_4db8 = (code *)0x11c7bd;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c7bd;
      }
      pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).custom_cmp;
      ppfVar25 = (fdb_kvs_handle **)((long)ppfVar31 + 1);
    } while ((char *)((long)ppfVar31 + 1) != (char *)0x80);
    ppfVar31 = (fdb_kvs_handle **)((long)ppfStack_4db0 + 1);
    uVar26 = uVar26 + 0x80;
    pfVar9 = (fdb_kvs_handle *)&pfStack_4da8[1].bub_ctx.space_used;
  } while (ppfVar31 != (fdb_kvs_handle **)0x8);
  ppfVar31 = apfStack_4d30 + 0x40;
  ppfVar12 = apfStack_4a30;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    uVar26 = 0;
    do {
      pcStack_4db8 = (code *)0x11c511;
      sprintf((char *)ppfVar31,"key%08d",uVar26);
      pcStack_4db8 = (code *)0x11c524;
      sprintf((char *)ppfVar12,"value%08d",uVar26);
      pcVar19 = (char *)apfStack_4a30[(long)&pfVar9->op_stats];
      pcStack_4db8 = (code *)0x11c534;
      sVar5 = strlen((char *)ppfVar31);
      pcVar29 = (char *)(sVar5 + 1);
      pcStack_4db8 = (code *)0x11c540;
      sVar5 = strlen((char *)ppfVar12);
      pcStack_4db8 = (code *)0x11c555;
      pfVar34 = (fdb_kvs_handle *)pcVar19;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar19,ppfVar31,(size_t)pcVar29,ppfVar12,sVar5 + 1);
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7bd;
      uVar13 = (int)uVar26 + 1;
      uVar26 = (ulong)uVar13;
    } while (uVar13 != 10);
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  pcVar29 = (char *)0x0;
  do {
    pfVar34 = apfStack_4da0[(long)pcVar29];
    if (((ulong)pcVar29 & 1) == 0) {
      pcStack_4db8 = (code *)0x11c583;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\0');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7e5;
    }
    else {
      pcStack_4db8 = (code *)0x11c596;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\x01');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ea;
    }
    pcVar29 = (char *)((long)pcVar29 + 1);
  } while (pcVar29 != (char *)0x8);
  pcVar29 = "key%08d";
  ppfVar31 = apfStack_4d30 + 0x40;
  ppfVar12 = (fdb_kvs_handle **)0x0;
  do {
    uVar26 = 0;
    do {
      pcStack_4db8 = (code *)0x11c5ca;
      sprintf((char *)ppfVar31,"key%08d",uVar26);
      pfVar9 = apfStack_4a30[(long)(ppfVar12 + 4)];
      pcStack_4db8 = (code *)0x11c5da;
      sVar5 = strlen((char *)ppfVar31);
      pcStack_4db8 = (code *)0x11c5e9;
      pfVar34 = pfVar9;
      fVar2 = fdb_del_kv(pfVar9,ppfVar31,sVar5 + 1);
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c2;
      uVar13 = (int)uVar26 + 1;
      uVar26 = (ulong)uVar13;
    } while (uVar13 != 10);
    ppfVar12 = (fdb_kvs_handle **)((long)ppfVar12 + 1);
  } while (ppfVar12 != (fdb_kvs_handle **)0x400);
  pcVar29 = (char *)0x0;
  do {
    pfVar34 = apfStack_4da0[(long)pcVar29];
    if (((ulong)pcVar29 & 1) == 0) {
      pcStack_4db8 = (code *)0x11c617;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\0');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ef;
    }
    else {
      pcStack_4db8 = (code *)0x11c62a;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\x01');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f4;
    }
    pcVar29 = (char *)((long)pcVar29 + 1);
  } while (pcVar29 != (char *)0x8);
  ppfVar31 = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar29 = (char *)(apfStack_4a30 + 0x20);
  do {
    pcStack_4db8 = (code *)0x11c657;
    ppfVar25 = (fdb_kvs_handle **)pcVar29;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar29,10);
    iVar4 = (int)ppfVar25;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7cc;
    ppfVar31 = ppfVar31 + 8;
    pcVar29 = (char *)((long)pcVar29 + 0x200);
  } while (ppfVar31 < (fdb_kvs_handle **)0x3c0);
  ppfVar12 = apfStack_4da0;
  pcVar29 = "kvs%d";
  ppfVar31 = apfStack_4d30;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pfVar34 = apfStack_4a30[(long)&pfVar9->op_stats];
    pcStack_4db8 = (code *)0x11c697;
    fVar2 = fdb_kvs_close(pfVar34);
    iVar4 = (int)pfVar34;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d6;
    pcStack_4db8 = (code *)0x11c6af;
    sprintf((char *)ppfVar31,"kvs%d",(ulong)pfVar9 & 0xffffffff);
    pfVar34 = *ppfVar12;
    pcStack_4db8 = (code *)0x11c6bb;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar34,(char *)ppfVar31);
    iVar4 = (int)pfVar34;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d1;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->config).wal_threshold;
    ppfVar12 = ppfVar12 + 1;
  } while (pfVar9 != (fdb_kvs_handle *)0x400);
  pcVar29 = (char *)0x0;
  do {
    pfVar34 = apfStack_4da0[(long)pcVar29];
    if (((ulong)pcVar29 & 1) == 0) {
      pcStack_4db8 = (code *)0x11c6e7;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\0');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f9;
    }
    else {
      pcStack_4db8 = (code *)0x11c6fa;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar34,'\x01');
      iVar4 = (int)pfVar34;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7fe;
    }
    pcVar29 = (char *)((long)pcVar29 + 1);
  } while (pcVar29 != (char *)0x8);
  pcVar29 = "mvcc_test_compact%d";
  ppfVar31 = apfStack_4d30;
  pfVar9 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_4db8 = (code *)0x11c72d;
    sprintf((char *)ppfVar31,"mvcc_test_compact%d",(ulong)pfVar9 & 0xffffffff);
    pfVar34 = apfStack_4da0[(long)pfVar9];
    pcStack_4db8 = (code *)0x11c73a;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar34,(char *)ppfVar31);
    iVar4 = (int)pfVar34;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7db;
    pfVar9 = (fdb_kvs_handle *)&(pfVar9->kvs_config).field_0x1;
  } while (pfVar9 != (fdb_kvs_handle *)0x8);
  pcVar29 = (char *)0x0;
  pcStack_4db8 = (code *)0x11c754;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar34 = apfStack_4da0[(long)pcVar29];
    pcStack_4db8 = (code *)0x11c75e;
    fVar2 = fdb_close((fdb_file_handle *)pfVar34);
    iVar4 = (int)pfVar34;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar29 = (char *)((long)pcVar29 + 1);
    if (pcVar29 == (char *)0x8) {
      pcStack_4db8 = (code *)0x11c770;
      fdb_shutdown();
      pcStack_4db8 = (code *)0x11c775;
      memleak_end();
      pcVar19 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_4db8 = (code *)0x11c7a6;
      fprintf(_stderr,pcVar19,"open multi files kvs test");
      return;
    }
  }
LAB_0011c7e0:
  pcStack_4db8 = (code *)0x11c7e5;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7e5:
  pcStack_4db8 = (code *)0x11c7ea;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ea:
  pcStack_4db8 = (code *)0x11c7ef;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ef:
  pcStack_4db8 = (code *)0x11c7f4;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f4:
  pcStack_4db8 = (code *)0x11c7f9;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f9:
  pcStack_4db8 = (code *)0x11c7fe;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7fe:
  pcStack_4db8 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_52c0 = (code *)0x11c825;
  ppfStack_4de0 = (fdb_kvs_handle **)pcVar29;
  ppfStack_4dd8 = ppfVar12;
  pfStack_4dd0 = (fdb_kvs_handle *)pcVar19;
  ppfStack_4dc8 = ppfVar31;
  pfStack_4dc0 = pfVar9;
  pcStack_4db8 = (code *)uVar26;
  gettimeofday(&tStack_5238,(__timezone_ptr_t)0x0);
  pcStack_52c0 = (code *)0x11c82a;
  memleak_start();
  pcStack_52c0 = (code *)0x11c83a;
  fdb_get_default_config();
  pcStack_52c0 = (code *)0x11c844;
  fdb_get_default_kvs_config();
  fStack_4ed8.flags = 1;
  fStack_4ed8.block_reusing_threshold = 0;
  fStack_4ed8.seqtree_opt = 0;
  pcStack_52c0 = (code *)0x11c86a;
  fStack_4ed8.multi_kv_instances = (bool)(char)iVar4;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_52c0 = (code *)0x11c87e;
  fdb_open((fdb_file_handle **)&pfStack_52a8,"./mvcc_test1",(fdb_config *)(acStack_4fd8 + 0x100));
  iStack_5284 = iVar4;
  if (iVar4 == 0) {
    pcStack_52c0 = (code *)0x11c8ea;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_52a8,apfStack_5278,&fStack_5258);
    pcVar19 = (char *)0x1;
  }
  else {
    ppfVar12 = apfStack_5278;
    uVar26 = 0;
    do {
      pcStack_52c0 = (code *)0x11c8af;
      sprintf(acStack_5240,"kv%d",uVar26 & 0xffffffff);
      pcStack_52c0 = (code *)0x11c8c2;
      fdb_kvs_open((fdb_file_handle *)pfStack_52a8,ppfVar12,acStack_5240,&fStack_5258);
      uVar26 = uVar26 + 1;
      ppfVar12 = ppfVar12 + 1;
    } while (uVar26 != 3);
    pcVar19 = (char *)0x3;
  }
  uStack_52ac = 0;
  do {
    uVar26 = 0;
    do {
      pcStack_52c0 = (code *)0x11c916;
      sprintf(acStack_50d8,"key%d",uVar26 & 0xffffffff);
      pcStack_52c0 = (code *)0x11c937;
      sprintf(acStack_5228,"meta-%d-%d",(ulong)uStack_52ac,uVar26 & 0xffffffff);
      pcStack_52c0 = (code *)0x11c956;
      sprintf(acStack_4fd8,"body-%d-%d",(ulong)uStack_52ac,uVar26 & 0xffffffff);
      doc = (btree *)(&bStack_5128.ksize + uVar26 * 8);
      pcStack_52c0 = (code *)0x11c969;
      sVar5 = strlen(acStack_50d8);
      pcStack_52c0 = (code *)0x11c979;
      metalen._M_i = strlen(acStack_5228);
      pcStack_52c0 = (code *)0x11c984;
      sVar6 = strlen(acStack_4fd8);
      pcStack_52c0 = (code *)0x11c9a9;
      fdb_doc_create((fdb_doc **)doc,acStack_50d8,sVar5,acStack_5228,metalen._M_i,acStack_4fd8,sVar6
                    );
      pfVar9 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_52c0 = (code *)0x11c9ba;
        fdb_set(apfStack_5278[(long)pfVar9],*(fdb_doc **)doc);
        pfVar9 = (fdb_kvs_handle *)((long)pfVar9 + 1);
      } while ((fdb_kvs_handle *)pcVar19 != pfVar9);
      pcStack_52c0 = (code *)0x11c9cf;
      fdb_doc_free(*(fdb_doc **)(&bStack_5128.ksize + uVar26 * 8));
      uVar26 = uVar26 + 1;
    } while (uVar26 != 10);
    pcStack_52c0 = (code *)0x11c9f3;
    fdb_commit((fdb_file_handle *)pfStack_52a8,~(byte)uStack_52ac & 1);
    uStack_52ac = uStack_52ac + 1;
    pcVar29 = (char *)(ulong)uStack_52ac;
  } while (uStack_52ac != 5);
  pcStack_52c0 = (code *)0x11ca16;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_52a8,&pfStack_5290,&uStack_5260);
  pfVar34 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_52c0 = (code *)0x11ca35;
    fVar2 = fdb_rollback(apfStack_5278,(pfStack_5290[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd19;
    pfStack_52a0 = (fdb_kvs_handle *)0x0;
    pcVar29 = acStack_4fd8;
    pfVar34 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_52c0 = (code *)0x11ca6a;
      fVar2 = fdb_snapshot_open(apfStack_5278[(long)pfVar34],&pfStack_5280,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccfb:
        pcStack_52c0 = (code *)0x11cd00;
        rollback_without_seqtree();
LAB_0011cd00:
        pcStack_52c0 = (code *)0x11cd05;
        rollback_without_seqtree();
LAB_0011cd05:
        pcStack_52c0 = (code *)0x11cd0a;
        rollback_without_seqtree();
LAB_0011cd0a:
        pcStack_52c0 = (code *)0x11cd0f;
        rollback_without_seqtree();
        goto LAB_0011cd0f;
      }
      pcStack_52c0 = (code *)0x11ca92;
      fVar2 = fdb_iterator_init(pfStack_5280,&pfStack_5298,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccf6:
        pcStack_52c0 = (code *)0x11ccfb;
        rollback_without_seqtree();
        goto LAB_0011ccfb;
      }
      metalen._M_i = 0;
      do {
        pcStack_52c0 = (code *)0x11caac;
        fVar2 = fdb_iterator_get(pfStack_5298,(fdb_doc **)&pfStack_52a0);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccd1:
          pcStack_52c0 = (code *)0x11ccd6;
          rollback_without_seqtree();
LAB_0011ccd6:
          pcStack_52c0 = (code *)0x11cce6;
          rollback_without_seqtree();
LAB_0011cce6:
          pcStack_52c0 = (code *)0x11ccf6;
          rollback_without_seqtree();
          goto LAB_0011ccf6;
        }
        pcStack_52c0 = (code *)0x11cacd;
        sprintf(acStack_50d8,"key%d",metalen._M_i);
        if (pfVar34 == (fdb_kvs_handle *)0x0) {
          pcStack_52c0 = (code *)0x11cb1c;
          sprintf(acStack_5228,"meta-1-%d",metalen._M_i);
          pcStack_52c0 = (code *)0x11cb30;
          sprintf(pcVar29,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_52c0 = (code *)0x11caf0;
          sprintf(acStack_5228,"meta-%d-%d",4,metalen._M_i);
          pcStack_52c0 = (code *)0x11cb09;
          sprintf(pcVar29,"body-%d-%d",4);
        }
        pfVar9 = pfStack_52a0;
        doc = (btree *)pfStack_52a0->op_stats;
        pcStack_52c0 = (code *)0x11cb4c;
        iVar4 = bcmp(doc,acStack_50d8,*(size_t *)&pfStack_52a0->kvs_config);
        if (iVar4 != 0) {
          pcStack_52c0 = (code *)0x11ccd1;
          rollback_without_seqtree();
          goto LAB_0011ccd1;
        }
        doc = pfVar9->staletree;
        pcStack_52c0 = (code *)0x11cb6c;
        iVar4 = bcmp(doc,acStack_5228,(size_t)(pfVar9->kvs_config).custom_cmp);
        if (iVar4 != 0) goto LAB_0011cce6;
        doc = (pfVar9->field_6).seqtree;
        pcStack_52c0 = (code *)0x11cb87;
        iVar4 = bcmp(doc,pcVar29,(size_t)(pfVar9->kvs_config).custom_cmp_param);
        if (iVar4 != 0) goto LAB_0011ccd6;
        pcStack_52c0 = (code *)0x11cb97;
        fdb_doc_free((fdb_doc *)pfVar9);
        pfStack_52a0 = (fdb_kvs_handle *)0x0;
        uVar13 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar13;
        pcStack_52c0 = (code *)0x11cbad;
        fVar2 = fdb_iterator_next(pfStack_5298);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar13 != 10) goto LAB_0011cd00;
      pcStack_52c0 = (code *)0x11cbca;
      fVar2 = fdb_iterator_close(pfStack_5298);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd05;
      pcStack_52c0 = (code *)0x11cbdc;
      fVar2 = fdb_kvs_close(pfStack_5280);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0a;
      pfVar34 = (fdb_kvs_handle *)&(pfVar34->kvs_config).field_0x1;
    } while (pfVar34 != (fdb_kvs_handle *)pcVar19);
    pcVar29 = (char *)0x0;
    do {
      pcStack_52c0 = (code *)0x11cbfc;
      fVar2 = fdb_kvs_close(apfStack_5278[(long)pcVar29]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0f;
      pcVar29 = pcVar29 + 1;
    } while (pcVar19 != pcVar29);
    pcStack_52c0 = (code *)0x11cc1f;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_52a8,pfStack_5290[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd1e;
    pcStack_52c0 = (code *)0x11cc36;
    fVar2 = fdb_free_snap_markers(pfStack_5290,uStack_5260);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_52c0 = (code *)0x11cc48;
      fdb_close((fdb_file_handle *)pfStack_52a8);
      pcStack_52c0 = (code *)0x11cc4d;
      fdb_shutdown();
      pcStack_52c0 = (code *)0x11cc52;
      memleak_end();
      pcVar19 = "single kv mode:";
      if ((char)iStack_5284 != '\0') {
        pcVar19 = "multiple kv mode:";
      }
      pcStack_52c0 = (code *)0x11cc82;
      sprintf(acStack_4fd8,"rollback without seqtree in %s",pcVar19);
      pcVar19 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar19 = "%s FAILED\n";
      }
      pcStack_52c0 = (code *)0x11ccaf;
      fprintf(_stderr,pcVar19,acStack_4fd8);
      return;
    }
  }
  else {
LAB_0011cd14:
    pcStack_52c0 = (code *)0x11cd19;
    rollback_without_seqtree();
LAB_0011cd19:
    pcStack_52c0 = (code *)0x11cd1e;
    rollback_without_seqtree();
LAB_0011cd1e:
    pcStack_52c0 = (code *)0x11cd23;
    rollback_without_seqtree();
  }
  pcStack_52c0 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_5498 = (fdb_kvs_handle *)0x11cd45;
  pcStack_52e8 = pcVar29;
  aStack_52e0.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_52d8 = doc;
  pfStack_52d0 = pfVar9;
  pfStack_52c8 = pfVar34;
  pcStack_52c0 = (code *)pcVar19;
  gettimeofday(&tStack_5438,(__timezone_ptr_t)0x0);
  pfStack_5498 = (fdb_kvs_handle *)0x11cd4a;
  memleak_start();
  pfStack_5498 = (fdb_kvs_handle *)0x11cd56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar19 = auStack_5428 + 0x48;
  pfStack_5498 = (fdb_kvs_handle *)0x11cd66;
  fdb_get_default_config();
  pfStack_5498 = (fdb_kvs_handle *)0x11cd78;
  fVar2 = fdb_open(&pfStack_5490,"./mvcc_test2",(fdb_config *)pcVar19);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar19 = auStack_5428;
    pfStack_5498 = (fdb_kvs_handle *)0x11cd8d;
    fdb_get_default_kvs_config();
    pbStack_5440 = (btreeblk_handle *)auStack_5428._16_8_;
    pfStack_5450 = (filemgr *)auStack_5428._0_8_;
    pdStack_5448 = (docio_handle *)auStack_5428._8_8_;
    pfStack_5498 = (fdb_kvs_handle *)0x11cdae;
    fVar2 = fdb_kvs_open_default(pfStack_5490,&pfStack_5488,(fdb_kvs_config *)&pfStack_5450);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0b9;
    pfStack_5498 = (fdb_kvs_handle *)0x11cdc4;
    fVar2 = fdb_begin_transaction(pfStack_5490,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0be;
    pcVar19 = "key%d";
    pfVar9 = (fdb_kvs_handle *)acStack_547f;
    pfVar34 = (fdb_kvs_handle *)0x1555bd;
    uVar26 = 0;
    do {
      pfStack_5498 = (fdb_kvs_handle *)0x11cdf0;
      sprintf((char *)pfVar9,"key%d",uVar26);
      handle = pfStack_5488;
      pfStack_5498 = (fdb_kvs_handle *)0x11cdfd;
      sVar5 = strlen((char *)pfVar9);
      pfStack_5498 = (fdb_kvs_handle *)0x11ce14;
      fVar2 = fdb_set_kv(handle,pfVar9,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_5498 = (fdb_kvs_handle *)0x11d0a5;
        tx_crash_recover_test();
        goto LAB_0011d0a5;
      }
      uVar13 = (int)uVar26 + 1;
      uVar26 = (ulong)uVar13;
    } while (uVar13 != 10);
    pfStack_5498 = (fdb_kvs_handle *)0x11ce31;
    fVar2 = fdb_end_transaction(pfStack_5490,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c3;
    pfStack_5498 = (fdb_kvs_handle *)0x11ce49;
    fdb_compact(pfStack_5490,"./mvcc_test3");
    pfStack_5498 = (fdb_kvs_handle *)0x11ce57;
    fVar2 = fdb_begin_transaction(pfStack_5490,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c8;
    pcVar19 = "key%d";
    pfVar9 = (fdb_kvs_handle *)acStack_547f;
    uVar13 = 0;
    do {
      pfStack_5498 = (fdb_kvs_handle *)0x11ce7c;
      sprintf((char *)pfVar9,"key%d",(ulong)uVar13);
      pfVar34 = pfStack_5488;
      pfStack_5498 = (fdb_kvs_handle *)0x11ce89;
      sVar5 = strlen((char *)pfVar9);
      pfStack_5498 = (fdb_kvs_handle *)0x11ce97;
      fVar2 = fdb_del_kv(pfVar34,pfVar9,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0a5;
      uVar13 = uVar13 + 1;
    } while (uVar13 != 10);
    pfStack_5498 = (fdb_kvs_handle *)0x11ceb4;
    fVar2 = fdb_get_file_info(pfStack_5490,(fdb_file_info *)auStack_5428);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0cd;
    pcVar19 = (char *)((ulong)auStack_5428._40_8_ / (ulong)uStack_53dc);
    pfStack_5498 = (fdb_kvs_handle *)0x11cedc;
    fdb_close(pfStack_5490);
    pfStack_5498 = (fdb_kvs_handle *)0x11cee1;
    fdb_shutdown();
    pfStack_5498 = (fdb_kvs_handle *)0x11cf00;
    iVar4 = _disk_dump("./mvcc_test3",(ulong)uStack_53dc * (long)pcVar19,
                       (ulong)((uStack_53dc >> 2) + uStack_53dc * 2));
    if (iVar4 < 0) goto LAB_0011d0d2;
    pfStack_5498 = (fdb_kvs_handle *)0x11cf2a;
    iVar4 = _disk_dump("./mvcc_test2",((long)pcVar19 * 4 + 8) * (ulong)uStack_53dc,
                       (ulong)(uStack_53dc >> 2));
    if (iVar4 < 0) goto LAB_0011d0d7;
    pfStack_5498 = (fdb_kvs_handle *)0x11cf49;
    fVar2 = fdb_open(&pfStack_5490,"./mvcc_test3",(fdb_config *)(auStack_5428 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0dc;
    pcVar19 = (char *)&pfStack_5470;
    pfStack_5498 = (fdb_kvs_handle *)0x11cf5e;
    fdb_get_default_kvs_config();
    pbStack_5440 = pbStack_5460;
    pfStack_5450 = pfStack_5470;
    pdStack_5448 = pdStack_5468;
    pfStack_5498 = (fdb_kvs_handle *)0x11cf7f;
    fVar2 = fdb_kvs_open_default(pfStack_5490,&pfStack_5488,(fdb_kvs_config *)&pfStack_5450);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0e1;
    pfStack_5498 = (fdb_kvs_handle *)0x11cf95;
    fVar2 = fdb_begin_transaction(pfStack_5490,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar13 = 0;
      do {
        pfStack_5498 = (fdb_kvs_handle *)0x11cfba;
        sprintf(acStack_547f,"key%d",(ulong)uVar13);
        pfVar34 = pfStack_5488;
        pfStack_5498 = (fdb_kvs_handle *)0x11cfc7;
        sVar5 = strlen(acStack_547f);
        pfStack_5498 = (fdb_kvs_handle *)0x11cfd5;
        fVar2 = fdb_del_kv(pfVar34,acStack_547f,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0aa;
        uVar13 = uVar13 + 1;
      } while (uVar13 != 10);
      pfStack_5498 = (fdb_kvs_handle *)0x11cfed;
      fdb_abort_transaction(pfStack_5490);
      pfVar34 = (fdb_kvs_handle *)&pfStack_5470;
      uVar13 = 0;
      while( true ) {
        pfStack_5498 = (fdb_kvs_handle *)0x11d014;
        sprintf(acStack_547f,"key%d",(ulong)uVar13);
        pfVar9 = pfStack_5488;
        pfStack_5498 = (fdb_kvs_handle *)0x11d021;
        sVar5 = strlen(acStack_547f);
        pfStack_5498 = (fdb_kvs_handle *)0x11d035;
        fVar2 = fdb_get_kv(pfVar9,acStack_547f,sVar5,(void **)pfVar34,&sStack_5458);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_5498 = (fdb_kvs_handle *)0x11d043;
        free(pfStack_5470);
        uVar13 = uVar13 + 1;
        if (uVar13 == 10) {
          pfStack_5498 = (fdb_kvs_handle *)0x11d053;
          fdb_close(pfStack_5490);
          pfStack_5498 = (fdb_kvs_handle *)0x11d058;
          fdb_shutdown();
          pfStack_5498 = (fdb_kvs_handle *)0x11d05d;
          memleak_end();
          pcVar19 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar19 = "%s FAILED\n";
          }
          pfStack_5498 = (fdb_kvs_handle *)0x11d08e;
          fprintf(_stderr,pcVar19,"crash recover test");
          return;
        }
      }
LAB_0011d0af:
      pfVar9 = (fdb_kvs_handle *)acStack_547f;
      pcVar19 = "key%d";
      pfStack_5498 = (fdb_kvs_handle *)0x11d0b4;
      tx_crash_recover_test();
      goto LAB_0011d0b4;
    }
  }
  else {
LAB_0011d0b4:
    pfStack_5498 = (fdb_kvs_handle *)0x11d0b9;
    tx_crash_recover_test();
LAB_0011d0b9:
    pfStack_5498 = (fdb_kvs_handle *)0x11d0be;
    tx_crash_recover_test();
LAB_0011d0be:
    pfStack_5498 = (fdb_kvs_handle *)0x11d0c3;
    tx_crash_recover_test();
LAB_0011d0c3:
    pfStack_5498 = (fdb_kvs_handle *)0x11d0c8;
    tx_crash_recover_test();
LAB_0011d0c8:
    pfStack_5498 = (fdb_kvs_handle *)0x11d0cd;
    tx_crash_recover_test();
LAB_0011d0cd:
    pfStack_5498 = (fdb_kvs_handle *)0x11d0d2;
    tx_crash_recover_test();
LAB_0011d0d2:
    pfStack_5498 = (fdb_kvs_handle *)0x11d0d7;
    tx_crash_recover_test();
LAB_0011d0d7:
    pfStack_5498 = (fdb_kvs_handle *)0x11d0dc;
    tx_crash_recover_test();
LAB_0011d0dc:
    pfStack_5498 = (fdb_kvs_handle *)0x11d0e1;
    tx_crash_recover_test();
LAB_0011d0e1:
    pfStack_5498 = (fdb_kvs_handle *)0x11d0e6;
    tx_crash_recover_test();
  }
  pfStack_5498 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_54a8 = (fdb_config *)pcVar19;
  pfStack_54a0 = pfVar9;
  pfStack_5498 = pfVar34;
  gettimeofday(&tStack_55c8,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_55d8 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_55e8,"./mvcc_test1",&fStack_55a0);
  fdb_kvs_open_default(pfStack_55e8,&pfStack_55d0,&fStack_55b8);
  fdb_kvs_open(pfStack_55e8,&pfStack_55f0,"kv",&fStack_55b8);
  fVar2 = fdb_set_kv(pfStack_55f0,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_55f0,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d304;
    fdb_commit(pfStack_55e8,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_55f0,&pfStack_55f8,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d30b;
    fVar2 = fdb_iterator_init(pfStack_55f8,&pfStack_55e0,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d310;
    fVar2 = fdb_kvs_close(pfStack_55f8);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d315;
    fVar2 = fdb_kvs_close(pfStack_55f0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d31a;
    fVar2 = fdb_kvs_remove(pfStack_55e8,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d31f;
    fVar2 = fdb_iterator_get(pfStack_55e0,&pfStack_55d8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d324;
    fdb_doc_free(pfStack_55d8);
    fVar2 = fdb_iterator_close(pfStack_55e0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d329;
    fVar2 = fdb_kvs_close(pfStack_55f8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d32e;
    fVar2 = fdb_kvs_close(pfStack_55d0);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_55e8);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar19 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar19 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar19,"drop kv other handle test");
        return;
      }
      goto LAB_0011d338;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d304:
    drop_kv_on_snap_iterator_test();
LAB_0011d30b:
    drop_kv_on_snap_iterator_test();
LAB_0011d310:
    drop_kv_on_snap_iterator_test();
LAB_0011d315:
    drop_kv_on_snap_iterator_test();
LAB_0011d31a:
    drop_kv_on_snap_iterator_test();
LAB_0011d31f:
    drop_kv_on_snap_iterator_test();
LAB_0011d324:
    drop_kv_on_snap_iterator_test();
LAB_0011d329:
    drop_kv_on_snap_iterator_test();
LAB_0011d32e:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d338:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void snapshot_concurrent_compaction_test()
{
    TEST_INIT();
    memleak_start();

    int i, j, idx, r;
    int n = 100;
    int commit_term = n/2;
    char keybuf[256], bodybuf[256];
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_status s;
    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    struct cb_snapshot_args cb_args;

    memset(&cb_args, 0x0, sizeof(struct cb_snapshot_args));
    fconfig.wal_threshold = 128;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_cb = cb_snapshot;
    fconfig.compaction_cb_ctx = &cb_args;
    fconfig.compaction_cb_mask = FDB_CS_BEGIN |
                                 FDB_CS_END;

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);
    fdb_kvs_open(dbfile, &db, "db", &kvs_config);
    cb_args.handle = db;

    // write docs & commit for each n/2 doc updates
    for (i=0;i<n;++i){
        idx = i;
        j = i/commit_term;
        sprintf(keybuf, "key%04d", idx);
        sprintf(bodybuf, "body%04d_update%d", idx, j);
        s = fdb_set_kv(db, keybuf, strlen(keybuf)+1,
                           bodybuf, strlen(bodybuf)+1);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        if ((i+1)%commit_term == 0) {
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        }
    }
    cb_args.ndocs = n;
    cb_args.nupdates = 2;
    cb_args.niterations = 10;

    _snapshot_check(db, cb_args.ndocs, cb_args.nupdates);

    s = fdb_compact(dbfile, "./mvcc_test2");
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("snapshot with concurrent compaction test");
}